

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::sse2::CurveNiIntersector1<4>::
     occluded_t<embree::sse2::RibbonCurve1Intersector1<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1EpilogMU<4,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive *pPVar2;
  undefined1 (*pauVar3) [16];
  Primitive PVar4;
  undefined4 uVar5;
  int iVar6;
  Geometry *pGVar7;
  RTCFilterFunctionN p_Var8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined6 uVar11;
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  RTCFilterFunctionN *pp_Var31;
  byte bVar32;
  int iVar33;
  ulong uVar34;
  long lVar35;
  undefined1 *puVar36;
  _func_int **pp_Var37;
  ulong uVar38;
  bool bVar39;
  Geometry *pGVar40;
  Geometry *geometry;
  long lVar41;
  ulong uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  short sVar47;
  float fVar48;
  float fVar79;
  float fVar80;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar63 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar81;
  float fVar82;
  float fVar91;
  float fVar93;
  vfloat4 v;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar92;
  float fVar94;
  float fVar95;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar96;
  float fVar97;
  float fVar102;
  float fVar103;
  float fVar104;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar115;
  float fVar118;
  vfloat4 v_1;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  float fVar123;
  float fVar133;
  float fVar134;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  float fVar135;
  float fVar146;
  float fVar147;
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  float fVar148;
  float fVar156;
  float fVar157;
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar158;
  float fVar176;
  float fVar177;
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar165 [16];
  undefined1 auVar168 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar175 [16];
  float fVar178;
  float fVar185;
  float fVar186;
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar190;
  float fVar191;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar199;
  float fVar201;
  float fVar203;
  undefined1 auVar197 [16];
  float fVar200;
  float fVar202;
  float fVar204;
  undefined1 auVar198 [16];
  float fVar205;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar214;
  undefined1 auVar210 [16];
  float fVar215;
  float fVar222;
  float fVar223;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar224;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  float fVar225;
  float fVar228;
  float fVar229;
  float fVar230;
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  float fVar231;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar240;
  float fVar241;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_4> bhit;
  undefined4 local_45c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  undefined1 local_448 [16];
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  float fStack_420;
  float fStack_41c;
  undefined1 local_418 [16];
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  float fStack_3f0;
  float fStack_3ec;
  undefined1 local_3e8 [4];
  undefined1 auStack_3e4 [8];
  float fStack_3dc;
  Precalculations *local_3d8;
  Ray *local_3d0;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [8];
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong local_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [8];
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [40];
  float local_290;
  float local_288;
  float fStack_284;
  float fStack_280;
  anon_struct_4_6_abad0318_for_Geometry_10 aStack_27c;
  undefined8 local_278;
  undefined8 uStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  undefined8 local_238;
  float local_230;
  float local_22c;
  undefined4 local_228;
  undefined4 local_224;
  undefined4 local_220;
  uint local_21c;
  uint local_218;
  RayQueryContext *local_208;
  ulong local_200;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  uint local_f8;
  int local_f4;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  float local_98 [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined1 local_78 [16];
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 uVar77;
  undefined2 uVar78;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  
  PVar4 = prim[1];
  uVar38 = (ulong)(byte)PVar4;
  pPVar2 = prim + uVar38 * 0x19 + 6;
  fVar93 = *(float *)(pPVar2 + 0xc);
  fVar105 = ((ray->org).field_0.m128[0] - *(float *)pPVar2) * fVar93;
  fVar115 = ((ray->org).field_0.m128[1] - *(float *)(pPVar2 + 4)) * fVar93;
  fVar118 = ((ray->org).field_0.m128[2] - *(float *)(pPVar2 + 8)) * fVar93;
  fVar81 = fVar93 * (ray->dir).field_0.m128[0];
  fVar91 = fVar93 * (ray->dir).field_0.m128[1];
  fVar93 = fVar93 * (ray->dir).field_0.m128[2];
  uVar5 = *(undefined4 *)(prim + uVar38 * 4 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar49._8_4_ = 0;
  auVar49._0_8_ = uVar42;
  auVar49._12_2_ = uVar78;
  auVar49._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar189._12_4_ = auVar49._12_4_;
  auVar189._8_2_ = 0;
  auVar189._0_8_ = uVar42;
  auVar189._10_2_ = uVar78;
  auVar59._10_6_ = auVar189._10_6_;
  auVar59._8_2_ = uVar78;
  auVar59._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar12._4_8_ = auVar59._8_8_;
  auVar12._2_2_ = uVar78;
  auVar12._0_2_ = uVar78;
  fVar96 = (float)((int)sVar47 >> 8);
  fVar102 = (float)(auVar12._0_4_ >> 0x18);
  fVar103 = (float)(auVar59._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar38 * 5 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar52._8_4_ = 0;
  auVar52._0_8_ = uVar42;
  auVar52._12_2_ = uVar78;
  auVar52._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._8_2_ = 0;
  auVar51._0_8_ = uVar42;
  auVar51._10_2_ = uVar78;
  auVar50._10_6_ = auVar51._10_6_;
  auVar50._8_2_ = uVar78;
  auVar50._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar13._4_8_ = auVar50._8_8_;
  auVar13._2_2_ = uVar78;
  auVar13._0_2_ = uVar78;
  fVar123 = (float)((int)sVar47 >> 8);
  fVar133 = (float)(auVar13._0_4_ >> 0x18);
  fVar134 = (float)(auVar50._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar38 * 6 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar55._8_4_ = 0;
  auVar55._0_8_ = uVar42;
  auVar55._12_2_ = uVar78;
  auVar55._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar54._12_4_ = auVar55._12_4_;
  auVar54._8_2_ = 0;
  auVar54._0_8_ = uVar42;
  auVar54._10_2_ = uVar78;
  auVar53._10_6_ = auVar54._10_6_;
  auVar53._8_2_ = uVar78;
  auVar53._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar14._4_8_ = auVar53._8_8_;
  auVar14._2_2_ = uVar78;
  auVar14._0_2_ = uVar78;
  fVar135 = (float)((int)sVar47 >> 8);
  fVar146 = (float)(auVar14._0_4_ >> 0x18);
  fVar147 = (float)(auVar53._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar38 * 0xb + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar58._8_4_ = 0;
  auVar58._0_8_ = uVar42;
  auVar58._12_2_ = uVar78;
  auVar58._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar57._12_4_ = auVar58._12_4_;
  auVar57._8_2_ = 0;
  auVar57._0_8_ = uVar42;
  auVar57._10_2_ = uVar78;
  auVar56._10_6_ = auVar57._10_6_;
  auVar56._8_2_ = uVar78;
  auVar56._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar15._4_8_ = auVar56._8_8_;
  auVar15._2_2_ = uVar78;
  auVar15._0_2_ = uVar78;
  fVar48 = (float)((int)sVar47 >> 8);
  fVar79 = (float)(auVar15._0_4_ >> 0x18);
  fVar80 = (float)(auVar56._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + (ulong)((uint)(byte)PVar4 * 0xc) + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar151._8_4_ = 0;
  auVar151._0_8_ = uVar42;
  auVar151._12_2_ = uVar78;
  auVar151._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar150._12_4_ = auVar151._12_4_;
  auVar150._8_2_ = 0;
  auVar150._0_8_ = uVar42;
  auVar150._10_2_ = uVar78;
  auVar149._10_6_ = auVar150._10_6_;
  auVar149._8_2_ = uVar78;
  auVar149._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar16._4_8_ = auVar149._8_8_;
  auVar16._2_2_ = uVar78;
  auVar16._0_2_ = uVar78;
  fVar148 = (float)((int)sVar47 >> 8);
  fVar156 = (float)(auVar16._0_4_ >> 0x18);
  fVar157 = (float)(auVar149._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + (uint)(byte)PVar4 * 0xc + uVar38 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar161._8_4_ = 0;
  auVar161._0_8_ = uVar42;
  auVar161._12_2_ = uVar78;
  auVar161._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar160._12_4_ = auVar161._12_4_;
  auVar160._8_2_ = 0;
  auVar160._0_8_ = uVar42;
  auVar160._10_2_ = uVar78;
  auVar159._10_6_ = auVar160._10_6_;
  auVar159._8_2_ = uVar78;
  auVar159._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar17._4_8_ = auVar159._8_8_;
  auVar17._2_2_ = uVar78;
  auVar17._0_2_ = uVar78;
  fVar187 = (float)((int)sVar47 >> 8);
  fVar190 = (float)(auVar17._0_4_ >> 0x18);
  fVar191 = (float)(auVar159._8_4_ >> 0x18);
  uVar34 = (ulong)(uint)((int)(uVar38 * 9) * 2);
  uVar5 = *(undefined4 *)(prim + uVar34 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar164._8_4_ = 0;
  auVar164._0_8_ = uVar42;
  auVar164._12_2_ = uVar78;
  auVar164._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar163._12_4_ = auVar164._12_4_;
  auVar163._8_2_ = 0;
  auVar163._0_8_ = uVar42;
  auVar163._10_2_ = uVar78;
  auVar162._10_6_ = auVar163._10_6_;
  auVar162._8_2_ = uVar78;
  auVar162._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar18._4_8_ = auVar162._8_8_;
  auVar18._2_2_ = uVar78;
  auVar18._0_2_ = uVar78;
  fVar178 = (float)((int)sVar47 >> 8);
  fVar185 = (float)(auVar18._0_4_ >> 0x18);
  fVar186 = (float)(auVar162._8_4_ >> 0x18);
  uVar5 = *(undefined4 *)(prim + uVar34 + uVar38 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar167._8_4_ = 0;
  auVar167._0_8_ = uVar42;
  auVar167._12_2_ = uVar78;
  auVar167._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar166._12_4_ = auVar167._12_4_;
  auVar166._8_2_ = 0;
  auVar166._0_8_ = uVar42;
  auVar166._10_2_ = uVar78;
  auVar165._10_6_ = auVar166._10_6_;
  auVar165._8_2_ = uVar78;
  auVar165._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar19._4_8_ = auVar165._8_8_;
  auVar19._2_2_ = uVar78;
  auVar19._0_2_ = uVar78;
  fVar192 = (float)((int)sVar47 >> 8);
  fVar193 = (float)(auVar19._0_4_ >> 0x18);
  fVar194 = (float)(auVar165._8_4_ >> 0x18);
  uVar34 = (ulong)(uint)((int)(uVar38 * 5) << 2);
  uVar5 = *(undefined4 *)(prim + uVar34 + 6);
  uVar77 = (undefined1)((uint)uVar5 >> 0x18);
  uVar78 = CONCAT11(uVar77,uVar77);
  uVar77 = (undefined1)((uint)uVar5 >> 0x10);
  uVar9 = CONCAT35(CONCAT21(uVar78,uVar77),CONCAT14(uVar77,uVar5));
  uVar77 = (undefined1)((uint)uVar5 >> 8);
  uVar11 = CONCAT51(CONCAT41((int)((ulong)uVar9 >> 0x20),uVar77),uVar77);
  sVar47 = CONCAT11((char)uVar5,(char)uVar5);
  uVar42 = CONCAT62(uVar11,sVar47);
  auVar170._8_4_ = 0;
  auVar170._0_8_ = uVar42;
  auVar170._12_2_ = uVar78;
  auVar170._14_2_ = uVar78;
  uVar78 = (undefined2)((ulong)uVar9 >> 0x20);
  auVar169._12_4_ = auVar170._12_4_;
  auVar169._8_2_ = 0;
  auVar169._0_8_ = uVar42;
  auVar169._10_2_ = uVar78;
  auVar168._10_6_ = auVar169._10_6_;
  auVar168._8_2_ = uVar78;
  auVar168._0_8_ = uVar42;
  uVar78 = (undefined2)uVar11;
  auVar20._4_8_ = auVar168._8_8_;
  auVar20._2_2_ = uVar78;
  auVar20._0_2_ = uVar78;
  fVar215 = (float)((int)sVar47 >> 8);
  fVar222 = (float)(auVar20._0_4_ >> 0x18);
  fVar223 = (float)(auVar168._8_4_ >> 0x18);
  fVar205 = fVar81 * fVar96 + fVar91 * fVar123 + fVar93 * fVar135;
  fVar211 = fVar81 * fVar102 + fVar91 * fVar133 + fVar93 * fVar146;
  fVar212 = fVar81 * fVar103 + fVar91 * fVar134 + fVar93 * fVar147;
  fVar213 = fVar81 * (float)(auVar189._12_4_ >> 0x18) +
            fVar91 * (float)(auVar51._12_4_ >> 0x18) + fVar93 * (float)(auVar54._12_4_ >> 0x18);
  fVar195 = fVar81 * fVar48 + fVar91 * fVar148 + fVar93 * fVar187;
  fVar199 = fVar81 * fVar79 + fVar91 * fVar156 + fVar93 * fVar190;
  fVar201 = fVar81 * fVar80 + fVar91 * fVar157 + fVar93 * fVar191;
  fVar203 = fVar81 * (float)(auVar57._12_4_ >> 0x18) +
            fVar91 * (float)(auVar150._12_4_ >> 0x18) + fVar93 * (float)(auVar160._12_4_ >> 0x18);
  fVar158 = fVar81 * fVar178 + fVar91 * fVar192 + fVar93 * fVar215;
  fVar176 = fVar81 * fVar185 + fVar91 * fVar193 + fVar93 * fVar222;
  fVar177 = fVar81 * fVar186 + fVar91 * fVar194 + fVar93 * fVar223;
  fVar81 = fVar81 * (float)(auVar163._12_4_ >> 0x18) +
           fVar91 * (float)(auVar166._12_4_ >> 0x18) + fVar93 * (float)(auVar169._12_4_ >> 0x18);
  fVar97 = fVar96 * fVar105 + fVar123 * fVar115 + fVar135 * fVar118;
  fVar146 = fVar102 * fVar105 + fVar133 * fVar115 + fVar146 * fVar118;
  fVar147 = fVar103 * fVar105 + fVar134 * fVar115 + fVar147 * fVar118;
  fVar104 = (float)(auVar189._12_4_ >> 0x18) * fVar105 +
            (float)(auVar51._12_4_ >> 0x18) * fVar115 + (float)(auVar54._12_4_ >> 0x18) * fVar118;
  fVar148 = fVar48 * fVar105 + fVar148 * fVar115 + fVar187 * fVar118;
  fVar156 = fVar79 * fVar105 + fVar156 * fVar115 + fVar190 * fVar118;
  fVar157 = fVar80 * fVar105 + fVar157 * fVar115 + fVar191 * fVar118;
  fVar187 = (float)(auVar57._12_4_ >> 0x18) * fVar105 +
            (float)(auVar150._12_4_ >> 0x18) * fVar115 + (float)(auVar160._12_4_ >> 0x18) * fVar118;
  fVar123 = fVar105 * fVar178 + fVar115 * fVar192 + fVar118 * fVar215;
  fVar133 = fVar105 * fVar185 + fVar115 * fVar193 + fVar118 * fVar222;
  fVar134 = fVar105 * fVar186 + fVar115 * fVar194 + fVar118 * fVar223;
  fVar135 = fVar105 * (float)(auVar163._12_4_ >> 0x18) +
            fVar115 * (float)(auVar166._12_4_ >> 0x18) + fVar118 * (float)(auVar169._12_4_ >> 0x18);
  fVar93 = (float)DAT_01f80d30;
  fVar48 = DAT_01f80d30._4_4_;
  fVar79 = DAT_01f80d30._8_4_;
  fVar80 = DAT_01f80d30._12_4_;
  uVar43 = -(uint)(fVar93 <= ABS(fVar205));
  uVar44 = -(uint)(fVar48 <= ABS(fVar211));
  uVar45 = -(uint)(fVar79 <= ABS(fVar212));
  uVar46 = -(uint)(fVar80 <= ABS(fVar213));
  auVar206._0_4_ = (uint)fVar205 & uVar43;
  auVar206._4_4_ = (uint)fVar211 & uVar44;
  auVar206._8_4_ = (uint)fVar212 & uVar45;
  auVar206._12_4_ = (uint)fVar213 & uVar46;
  auVar108._0_4_ = ~uVar43 & (uint)fVar93;
  auVar108._4_4_ = ~uVar44 & (uint)fVar48;
  auVar108._8_4_ = ~uVar45 & (uint)fVar79;
  auVar108._12_4_ = ~uVar46 & (uint)fVar80;
  auVar108 = auVar108 | auVar206;
  uVar43 = -(uint)(fVar93 <= ABS(fVar195));
  uVar44 = -(uint)(fVar48 <= ABS(fVar199));
  uVar45 = -(uint)(fVar79 <= ABS(fVar201));
  uVar46 = -(uint)(fVar80 <= ABS(fVar203));
  auVar197._0_4_ = (uint)fVar195 & uVar43;
  auVar197._4_4_ = (uint)fVar199 & uVar44;
  auVar197._8_4_ = (uint)fVar201 & uVar45;
  auVar197._12_4_ = (uint)fVar203 & uVar46;
  auVar124._0_4_ = ~uVar43 & (uint)fVar93;
  auVar124._4_4_ = ~uVar44 & (uint)fVar48;
  auVar124._8_4_ = ~uVar45 & (uint)fVar79;
  auVar124._12_4_ = ~uVar46 & (uint)fVar80;
  auVar124 = auVar124 | auVar197;
  uVar43 = -(uint)(fVar93 <= ABS(fVar158));
  uVar44 = -(uint)(fVar48 <= ABS(fVar176));
  uVar45 = -(uint)(fVar79 <= ABS(fVar177));
  uVar46 = -(uint)(fVar80 <= ABS(fVar81));
  auVar171._0_4_ = (uint)fVar158 & uVar43;
  auVar171._4_4_ = (uint)fVar176 & uVar44;
  auVar171._8_4_ = (uint)fVar177 & uVar45;
  auVar171._12_4_ = (uint)fVar81 & uVar46;
  auVar152._0_4_ = ~uVar43 & (uint)fVar93;
  auVar152._4_4_ = ~uVar44 & (uint)fVar48;
  auVar152._8_4_ = ~uVar45 & (uint)fVar79;
  auVar152._12_4_ = ~uVar46 & (uint)fVar80;
  auVar152 = auVar152 | auVar171;
  auVar59 = rcpps(_DAT_01f80d30,auVar108);
  fVar93 = auVar59._0_4_;
  fVar80 = auVar59._4_4_;
  fVar96 = auVar59._8_4_;
  fVar105 = auVar59._12_4_;
  fVar93 = (1.0 - auVar108._0_4_ * fVar93) * fVar93 + fVar93;
  fVar80 = (1.0 - auVar108._4_4_ * fVar80) * fVar80 + fVar80;
  fVar96 = (1.0 - auVar108._8_4_ * fVar96) * fVar96 + fVar96;
  fVar105 = (1.0 - auVar108._12_4_ * fVar105) * fVar105 + fVar105;
  auVar59 = rcpps(auVar59,auVar124);
  fVar48 = auVar59._0_4_;
  fVar81 = auVar59._4_4_;
  fVar102 = auVar59._8_4_;
  fVar115 = auVar59._12_4_;
  fVar48 = (1.0 - auVar124._0_4_ * fVar48) * fVar48 + fVar48;
  fVar81 = (1.0 - auVar124._4_4_ * fVar81) * fVar81 + fVar81;
  fVar102 = (1.0 - auVar124._8_4_ * fVar102) * fVar102 + fVar102;
  fVar115 = (1.0 - auVar124._12_4_ * fVar115) * fVar115 + fVar115;
  auVar59 = rcpps(auVar59,auVar152);
  fVar79 = auVar59._0_4_;
  fVar91 = auVar59._4_4_;
  fVar103 = auVar59._8_4_;
  fVar118 = auVar59._12_4_;
  fVar79 = (1.0 - auVar152._0_4_ * fVar79) * fVar79 + fVar79;
  fVar91 = (1.0 - auVar152._4_4_ * fVar91) * fVar91 + fVar91;
  fVar103 = (1.0 - auVar152._8_4_ * fVar103) * fVar103 + fVar103;
  fVar118 = (1.0 - auVar152._12_4_ * fVar118) * fVar118 + fVar118;
  uVar42 = *(ulong *)(prim + uVar38 * 7 + 6);
  uVar78 = (undefined2)(uVar42 >> 0x30);
  auVar62._8_4_ = 0;
  auVar62._0_8_ = uVar42;
  auVar62._12_2_ = uVar78;
  auVar62._14_2_ = uVar78;
  uVar78 = (undefined2)(uVar42 >> 0x20);
  auVar61._12_4_ = auVar62._12_4_;
  auVar61._8_2_ = 0;
  auVar61._0_8_ = uVar42;
  auVar61._10_2_ = uVar78;
  auVar60._10_6_ = auVar61._10_6_;
  auVar60._8_2_ = uVar78;
  auVar60._0_8_ = uVar42;
  uVar78 = (undefined2)(uVar42 >> 0x10);
  auVar21._4_8_ = auVar60._8_8_;
  auVar21._2_2_ = uVar78;
  auVar21._0_2_ = uVar78;
  auVar109._0_8_ =
       CONCAT44(((float)(auVar21._0_4_ >> 0x10) - fVar146) * fVar80,
                ((float)(int)(short)uVar42 - fVar97) * fVar93);
  auVar109._8_4_ = ((float)(auVar60._8_4_ >> 0x10) - fVar147) * fVar96;
  auVar109._12_4_ = ((float)(auVar61._12_4_ >> 0x10) - fVar104) * fVar105;
  uVar42 = *(ulong *)(prim + uVar38 * 9 + 6);
  uVar78 = (undefined2)(uVar42 >> 0x30);
  auVar65._8_4_ = 0;
  auVar65._0_8_ = uVar42;
  auVar65._12_2_ = uVar78;
  auVar65._14_2_ = uVar78;
  uVar78 = (undefined2)(uVar42 >> 0x20);
  auVar64._12_4_ = auVar65._12_4_;
  auVar64._8_2_ = 0;
  auVar64._0_8_ = uVar42;
  auVar64._10_2_ = uVar78;
  auVar63._10_6_ = auVar64._10_6_;
  auVar63._8_2_ = uVar78;
  auVar63._0_8_ = uVar42;
  uVar78 = (undefined2)(uVar42 >> 0x10);
  auVar22._4_8_ = auVar63._8_8_;
  auVar22._2_2_ = uVar78;
  auVar22._0_2_ = uVar78;
  local_448._0_4_ = ((float)(int)(short)uVar42 - fVar97) * fVar93;
  local_448._4_4_ = ((float)(auVar22._0_4_ >> 0x10) - fVar146) * fVar80;
  local_448._8_4_ = ((float)(auVar63._8_4_ >> 0x10) - fVar147) * fVar96;
  local_448._12_4_ = ((float)(auVar64._12_4_ >> 0x10) - fVar104) * fVar105;
  lVar35 = uVar34 + uVar38;
  uVar42 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + 6);
  uVar34 = *(ulong *)(prim + (ulong)(byte)PVar4 * 0x10 + uVar38 * -2 + 6);
  uVar78 = (undefined2)(uVar34 >> 0x30);
  auVar174._8_4_ = 0;
  auVar174._0_8_ = uVar34;
  auVar174._12_2_ = uVar78;
  auVar174._14_2_ = uVar78;
  uVar78 = (undefined2)(uVar34 >> 0x20);
  auVar173._12_4_ = auVar174._12_4_;
  auVar173._8_2_ = 0;
  auVar173._0_8_ = uVar34;
  auVar173._10_2_ = uVar78;
  auVar172._10_6_ = auVar173._10_6_;
  auVar172._8_2_ = uVar78;
  auVar172._0_8_ = uVar34;
  uVar78 = (undefined2)(uVar34 >> 0x10);
  auVar23._4_8_ = auVar172._8_8_;
  auVar23._2_2_ = uVar78;
  auVar23._0_2_ = uVar78;
  auVar175._0_8_ =
       CONCAT44(((float)(auVar23._0_4_ >> 0x10) - fVar156) * fVar81,
                ((float)(int)(short)uVar34 - fVar148) * fVar48);
  auVar175._8_4_ = ((float)(auVar172._8_4_ >> 0x10) - fVar157) * fVar102;
  auVar175._12_4_ = ((float)(auVar173._12_4_ >> 0x10) - fVar187) * fVar115;
  uVar78 = (undefined2)(uVar42 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar42;
  auVar68._12_2_ = uVar78;
  auVar68._14_2_ = uVar78;
  uVar78 = (undefined2)(uVar42 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar42;
  auVar67._10_2_ = uVar78;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar78;
  auVar66._0_8_ = uVar42;
  uVar78 = (undefined2)(uVar42 >> 0x10);
  auVar24._4_8_ = auVar66._8_8_;
  auVar24._2_2_ = uVar78;
  auVar24._0_2_ = uVar78;
  auVar69._0_4_ = ((float)(int)(short)uVar42 - fVar148) * fVar48;
  auVar69._4_4_ = ((float)(auVar24._0_4_ >> 0x10) - fVar156) * fVar81;
  auVar69._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar157) * fVar102;
  auVar69._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar187) * fVar115;
  uVar42 = *(ulong *)(prim + lVar35 + 6);
  uVar78 = (undefined2)(uVar42 >> 0x30);
  auVar138._8_4_ = 0;
  auVar138._0_8_ = uVar42;
  auVar138._12_2_ = uVar78;
  auVar138._14_2_ = uVar78;
  uVar78 = (undefined2)(uVar42 >> 0x20);
  auVar137._12_4_ = auVar138._12_4_;
  auVar137._8_2_ = 0;
  auVar137._0_8_ = uVar42;
  auVar137._10_2_ = uVar78;
  auVar136._10_6_ = auVar137._10_6_;
  auVar136._8_2_ = uVar78;
  auVar136._0_8_ = uVar42;
  uVar78 = (undefined2)(uVar42 >> 0x10);
  auVar25._4_8_ = auVar136._8_8_;
  auVar25._2_2_ = uVar78;
  auVar25._0_2_ = uVar78;
  auVar139._0_8_ =
       CONCAT44(((float)(auVar25._0_4_ >> 0x10) - fVar133) * fVar91,
                ((float)(int)(short)uVar42 - fVar123) * fVar79);
  auVar139._8_4_ = ((float)(auVar136._8_4_ >> 0x10) - fVar134) * fVar103;
  auVar139._12_4_ = ((float)(auVar137._12_4_ >> 0x10) - fVar135) * fVar118;
  uVar42 = *(ulong *)(prim + uVar38 * 0x17 + 6);
  uVar78 = (undefined2)(uVar42 >> 0x30);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar42;
  auVar181._12_2_ = uVar78;
  auVar181._14_2_ = uVar78;
  uVar78 = (undefined2)(uVar42 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar42;
  auVar180._10_2_ = uVar78;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar78;
  auVar179._0_8_ = uVar42;
  uVar78 = (undefined2)(uVar42 >> 0x10);
  auVar26._4_8_ = auVar179._8_8_;
  auVar26._2_2_ = uVar78;
  auVar26._0_2_ = uVar78;
  auVar182._0_4_ = ((float)(int)(short)uVar42 - fVar123) * fVar79;
  auVar182._4_4_ = ((float)(auVar26._0_4_ >> 0x10) - fVar133) * fVar91;
  auVar182._8_4_ = ((float)(auVar179._8_4_ >> 0x10) - fVar134) * fVar103;
  auVar182._12_4_ = ((float)(auVar180._12_4_ >> 0x10) - fVar135) * fVar118;
  auVar188._8_4_ = auVar109._8_4_;
  auVar188._0_8_ = auVar109._0_8_;
  auVar188._12_4_ = auVar109._12_4_;
  auVar189 = minps(auVar188,local_448);
  auVar83._8_4_ = auVar175._8_4_;
  auVar83._0_8_ = auVar175._0_8_;
  auVar83._12_4_ = auVar175._12_4_;
  auVar59 = minps(auVar83,auVar69);
  auVar189 = maxps(auVar189,auVar59);
  auVar84._8_4_ = auVar139._8_4_;
  auVar84._0_8_ = auVar139._0_8_;
  auVar84._12_4_ = auVar139._12_4_;
  auVar59 = minps(auVar84,auVar182);
  uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar125._4_4_ = uVar5;
  auVar125._0_4_ = uVar5;
  auVar125._8_4_ = uVar5;
  auVar125._12_4_ = uVar5;
  auVar59 = maxps(auVar59,auVar125);
  auVar59 = maxps(auVar189,auVar59);
  local_48 = auVar59._0_4_ * 0.99999964;
  fStack_44 = auVar59._4_4_ * 0.99999964;
  fStack_40 = auVar59._8_4_ * 0.99999964;
  fStack_3c = auVar59._12_4_ * 0.99999964;
  auVar59 = maxps(auVar109,local_448);
  auVar189 = maxps(auVar175,auVar69);
  auVar59 = minps(auVar59,auVar189);
  auVar189 = maxps(auVar139,auVar182);
  fVar93 = ray->tfar;
  auVar70._4_4_ = fVar93;
  auVar70._0_4_ = fVar93;
  auVar70._8_4_ = fVar93;
  auVar70._12_4_ = fVar93;
  local_418 = minps(auVar189,auVar70);
  auVar59 = minps(auVar59,local_418);
  local_438 = auVar59._0_4_ * 1.0000004;
  fStack_434 = auVar59._4_4_ * 1.0000004;
  fStack_430 = auVar59._8_4_ * 1.0000004;
  fStack_42c = auVar59._12_4_ * 1.0000004;
  auVar85._0_4_ = -(uint)(PVar4 != (Primitive)0x0 && local_48 <= local_438);
  auVar85._4_4_ = -(uint)(1 < (byte)PVar4 && fStack_44 <= fStack_434);
  auVar85._8_4_ = -(uint)(2 < (byte)PVar4 && fStack_40 <= fStack_430);
  auVar85._12_4_ = -(uint)(3 < (byte)PVar4 && fStack_3c <= fStack_42c);
  uVar43 = movmskps((int)lVar35,auVar85);
  if (uVar43 == 0) {
    bVar39 = false;
  }
  else {
    uVar43 = uVar43 & 0xff;
    local_2f8 = mm_lookupmask_ps._0_8_;
    uStack_2f0 = mm_lookupmask_ps._8_8_;
    local_3d0 = ray;
    local_3d8 = pre;
    do {
      uVar42 = (ulong)uVar43;
      lVar35 = 0;
      if (uVar42 != 0) {
        for (; (uVar43 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
        }
      }
      uVar42 = uVar42 - 1 & uVar42;
      local_300 = (ulong)*(uint *)(prim + 2);
      pGVar7 = (context->scene->geometries).items[*(uint *)(prim + 2)].ptr;
      local_200 = (ulong)*(uint *)(prim + lVar35 * 4 + 6);
      uVar34 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                               pGVar7[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(prim + lVar35 * 4 + 6));
      p_Var8 = pGVar7[1].intersectionFilterN;
      lVar35 = *(long *)&pGVar7[1].time_range.upper;
      pfVar1 = (float *)(lVar35 + (long)p_Var8 * uVar34);
      local_318 = *pfVar1;
      fStack_314 = pfVar1[1];
      fStack_310 = pfVar1[2];
      fStack_30c = pfVar1[3];
      pfVar1 = (float *)(lVar35 + (uVar34 + 1) * (long)p_Var8);
      local_358 = *pfVar1;
      fStack_354 = pfVar1[1];
      fStack_350 = pfVar1[2];
      fStack_34c = pfVar1[3];
      pfVar1 = (float *)(lVar35 + (uVar34 + 2) * (long)p_Var8);
      local_368 = *pfVar1;
      fStack_364 = pfVar1[1];
      fStack_360 = pfVar1[2];
      fStack_35c = pfVar1[3];
      lVar41 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
        }
      }
      pfVar1 = (float *)(lVar35 + (uVar34 + 3) * (long)p_Var8);
      local_378 = *pfVar1;
      fStack_374 = pfVar1[1];
      fStack_370 = pfVar1[2];
      fStack_36c = pfVar1[3];
      pGVar40 = (Geometry *)(uVar42 - 1);
      if ((uVar42 != 0) &&
         (pGVar40 = (Geometry *)((ulong)pGVar40 & uVar42), pGVar40 != (Geometry *)0x0)) {
        lVar35 = 0;
        if (pGVar40 != (Geometry *)0x0) {
          for (; ((ulong)pGVar40 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
          }
        }
        pGVar40 = (Geometry *)(ulong)*(uint *)(prim + lVar35 * 4 + 6);
      }
      iVar6 = (int)pGVar7[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      local_1e8 = (local_3d0->org).field_0.m128[0];
      fStack_1e4 = (local_3d0->org).field_0.m128[1];
      fStack_1e0 = (local_3d0->org).field_0.m128[2];
      fStack_1dc = (local_3d0->org).field_0.m128[3];
      fVar105 = local_318 - local_1e8;
      fVar115 = fStack_314 - fStack_1e4;
      fVar118 = fStack_310 - fStack_1e0;
      fVar93 = (local_3d8->ray_space).vx.field_0.m128[0];
      fVar48 = (local_3d8->ray_space).vx.field_0.m128[1];
      fVar79 = (local_3d8->ray_space).vx.field_0.m128[2];
      fVar80 = (local_3d8->ray_space).vy.field_0.m128[0];
      fVar81 = (local_3d8->ray_space).vy.field_0.m128[1];
      fVar91 = (local_3d8->ray_space).vy.field_0.m128[2];
      fVar96 = (local_3d8->ray_space).vz.field_0.m128[0];
      fVar102 = (local_3d8->ray_space).vz.field_0.m128[1];
      fVar103 = (local_3d8->ray_space).vz.field_0.m128[2];
      local_1c8 = fVar105 * fVar93 + fVar115 * fVar80 + fVar118 * fVar96;
      local_1d8 = fVar105 * fVar48 + fVar115 * fVar81 + fVar118 * fVar102;
      local_3b8 = fVar105 * fVar79 + fVar115 * fVar91 + fVar118 * fVar103;
      fVar105 = local_358 - local_1e8;
      fVar115 = fStack_354 - fStack_1e4;
      fVar118 = fStack_350 - fStack_1e0;
      local_268 = fVar105 * fVar93 + fVar115 * fVar80 + fVar118 * fVar96;
      local_1b8 = fVar105 * fVar48 + fVar115 * fVar81 + fVar118 * fVar102;
      local_2c8 = fVar105 * fVar79 + fVar115 * fVar91 + fVar118 * fVar103;
      fVar105 = local_368 - local_1e8;
      fVar115 = fStack_364 - fStack_1e4;
      fVar118 = fStack_360 - fStack_1e0;
      local_3c8 = fVar105 * fVar93 + fVar115 * fVar80 + fVar118 * fVar96;
      local_398 = fVar105 * fVar48 + fVar115 * fVar81 + fVar118 * fVar102;
      local_258 = fVar105 * fVar79 + fVar115 * fVar91 + fVar118 * fVar103;
      fVar105 = local_378 - local_1e8;
      fVar115 = fStack_374 - fStack_1e4;
      fVar118 = fStack_370 - fStack_1e0;
      local_3a8 = fVar105 * fVar93 + fVar115 * fVar80 + fVar118 * fVar96;
      local_248 = fVar105 * fVar48 + fVar115 * fVar81 + fVar118 * fVar102;
      local_388 = fVar105 * fVar79 + fVar115 * fVar91 + fVar118 * fVar103;
      auVar207._0_8_ = CONCAT44(local_1d8,local_1c8) & 0x7fffffff7fffffff;
      auVar207._8_4_ = ABS(local_3b8);
      auVar207._12_4_ = ABS(fStack_30c);
      auVar110._0_8_ = CONCAT44(local_1b8,local_268) & 0x7fffffff7fffffff;
      auVar110._8_4_ = ABS(local_2c8);
      auVar110._12_4_ = ABS(fStack_34c);
      auVar189 = maxps(auVar207,auVar110);
      auVar126._0_8_ = CONCAT44(local_398,local_3c8) & 0x7fffffff7fffffff;
      auVar126._8_4_ = ABS(local_258);
      auVar126._12_4_ = ABS(fStack_35c);
      auVar86._0_8_ = CONCAT44(local_248,local_3a8) & 0x7fffffff7fffffff;
      auVar86._8_4_ = ABS(local_388);
      auVar86._12_4_ = ABS(fStack_36c);
      auVar59 = maxps(auVar126,auVar86);
      auVar59 = maxps(auVar189,auVar59);
      fVar93 = auVar59._4_4_;
      if (auVar59._4_4_ <= auVar59._0_4_) {
        fVar93 = auVar59._0_4_;
      }
      fVar48 = (float)iVar6;
      auVar208._8_8_ = auVar59._8_8_;
      auVar208._0_8_ = auVar59._8_8_;
      if (auVar59._8_4_ <= fVar93) {
        auVar208._0_4_ = fVar93;
      }
      _local_1f8 = ZEXT416((uint)fVar48);
      lVar35 = (long)iVar6 * 0x44;
      fVar93 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar35 + 0x908);
      fVar79 = *(float *)(catmullrom_basis0 + lVar35 + 0x90c);
      fVar80 = *(float *)(catmullrom_basis0 + lVar35 + 0x910);
      auVar13 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar35 + 0x908);
      fVar81 = *(float *)(catmullrom_basis0 + lVar35 + 0x914);
      fStack_3c4 = local_3c8;
      fStack_3c0 = local_3c8;
      fStack_3bc = local_3c8;
      fStack_394 = local_398;
      fStack_390 = local_398;
      fStack_38c = local_398;
      fVar91 = *(float *)*(undefined1 (*) [12])(catmullrom_basis0 + lVar35 + 0xd8c);
      fVar96 = *(float *)(catmullrom_basis0 + lVar35 + 0xd90);
      fVar102 = *(float *)(catmullrom_basis0 + lVar35 + 0xd94);
      auVar12 = *(undefined1 (*) [12])(catmullrom_basis0 + lVar35 + 0xd8c);
      fVar103 = *(float *)(catmullrom_basis0 + lVar35 + 0xd98);
      fStack_244 = local_248;
      fStack_240 = local_248;
      fStack_23c = local_248;
      fVar105 = *(float *)(catmullrom_basis0 + lVar35 + 0x484);
      fVar115 = *(float *)(catmullrom_basis0 + lVar35 + 0x488);
      fVar118 = *(float *)(catmullrom_basis0 + lVar35 + 0x48c);
      fVar123 = *(float *)(catmullrom_basis0 + lVar35 + 0x490);
      fStack_1b4 = local_1b8;
      fStack_1b0 = local_1b8;
      fStack_1ac = local_1b8;
      fVar133 = *(float *)(catmullrom_basis0 + lVar35);
      fVar134 = *(float *)(catmullrom_basis0 + lVar35 + 4);
      fVar135 = *(float *)(catmullrom_basis0 + lVar35 + 8);
      fVar97 = *(float *)(catmullrom_basis0 + lVar35 + 0xc);
      fVar185 = local_1c8 * fVar133 + local_268 * fVar105 + local_3c8 * fVar93 + local_3a8 * fVar91;
      fVar186 = local_1c8 * fVar134 + local_268 * fVar115 + local_3c8 * fVar79 + local_3a8 * fVar96;
      fVar187 = local_1c8 * fVar135 + local_268 * fVar118 + local_3c8 * fVar80 + local_3a8 * fVar102
      ;
      fVar190 = local_1c8 * fVar97 + local_268 * fVar123 + local_3c8 * fVar81 + local_3a8 * fVar103;
      local_328 = local_1d8 * fVar133 +
                  local_1b8 * fVar105 + local_398 * fVar93 + local_248 * fVar91;
      fStack_324 = local_1d8 * fVar134 +
                   local_1b8 * fVar115 + local_398 * fVar79 + local_248 * fVar96;
      fStack_320 = local_1d8 * fVar135 +
                   local_1b8 * fVar118 + local_398 * fVar80 + local_248 * fVar102;
      fStack_31c = local_1d8 * fVar97 +
                   local_1b8 * fVar123 + local_398 * fVar81 + local_248 * fVar103;
      fVar191 = fStack_30c * fVar133 +
                fStack_34c * fVar105 + fStack_35c * fVar93 + fStack_36c * fVar91;
      fVar192 = fStack_30c * fVar134 +
                fStack_34c * fVar115 + fStack_35c * fVar79 + fStack_36c * fVar96;
      _local_3e8 = CONCAT44(fVar192,fVar191);
      auStack_3e4._4_4_ =
           fStack_30c * fVar135 + fStack_34c * fVar118 + fStack_35c * fVar80 + fStack_36c * fVar102;
      fStack_3dc = fStack_30c * fVar97 +
                   fStack_34c * fVar123 + fStack_35c * fVar81 + fStack_36c * fVar103;
      fVar93 = *(float *)(catmullrom_basis1 + lVar35 + 0xd8c);
      fVar79 = *(float *)(catmullrom_basis1 + lVar35 + 0xd90);
      fVar80 = *(float *)(catmullrom_basis1 + lVar35 + 0xd94);
      fVar91 = *(float *)(catmullrom_basis1 + lVar35 + 0xd98);
      fStack_3a4 = local_3a8;
      fStack_3a0 = local_3a8;
      fStack_39c = local_3a8;
      local_178 = *(float *)(catmullrom_basis1 + lVar35 + 0x908);
      fStack_174 = *(float *)(catmullrom_basis1 + lVar35 + 0x90c);
      fStack_170 = *(float *)(catmullrom_basis1 + lVar35 + 0x910);
      fStack_16c = *(float *)(catmullrom_basis1 + lVar35 + 0x914);
      local_148 = fStack_36c;
      fStack_144 = fStack_36c;
      fStack_140 = fStack_36c;
      fStack_13c = fStack_36c;
      local_138 = fStack_35c;
      fStack_134 = fStack_35c;
      fStack_130 = fStack_35c;
      fStack_12c = fStack_35c;
      pauVar3 = (undefined1 (*) [16])(catmullrom_basis1 + lVar35 + 0x484);
      fVar96 = *(float *)*pauVar3;
      fVar102 = *(float *)(catmullrom_basis1 + lVar35 + 0x488);
      fVar146 = *(float *)(catmullrom_basis1 + lVar35 + 0x48c);
      auVar14 = *(undefined1 (*) [12])*pauVar3;
      fVar147 = *(float *)(catmullrom_basis1 + lVar35 + 0x490);
      fStack_264 = local_268;
      fStack_260 = local_268;
      fStack_25c = local_268;
      local_158 = fStack_34c;
      fStack_154 = fStack_34c;
      fStack_150 = fStack_34c;
      fStack_14c = fStack_34c;
      _local_188 = *pauVar3;
      auVar59 = _local_188;
      fVar104 = *(float *)(catmullrom_basis1 + lVar35);
      fVar148 = *(float *)(catmullrom_basis1 + lVar35 + 4);
      fVar156 = *(float *)(catmullrom_basis1 + lVar35 + 8);
      fVar157 = *(float *)(catmullrom_basis1 + lVar35 + 0xc);
      fStack_1c4 = local_1c8;
      fStack_1c0 = local_1c8;
      fStack_1bc = local_1c8;
      fVar213 = local_1c8 * fVar104 +
                local_268 * fVar96 + local_3c8 * local_178 + local_3a8 * fVar93;
      fVar215 = local_1c8 * fVar148 +
                local_268 * fVar102 + local_3c8 * fStack_174 + local_3a8 * fVar79;
      fVar222 = local_1c8 * fVar156 +
                local_268 * fVar146 + local_3c8 * fStack_170 + local_3a8 * fVar80;
      fVar223 = local_1c8 * fVar157 +
                local_268 * fVar147 + local_3c8 * fStack_16c + local_3a8 * fVar91;
      fStack_1d4 = local_1d8;
      fStack_1d0 = local_1d8;
      fStack_1cc = local_1d8;
      fVar158 = local_1d8 * fVar104 +
                local_1b8 * fVar96 + local_398 * local_178 + local_248 * fVar93;
      fVar176 = local_1d8 * fVar148 +
                local_1b8 * fVar102 + local_398 * fStack_174 + local_248 * fVar79;
      fVar177 = local_1d8 * fVar156 +
                local_1b8 * fVar146 + local_398 * fStack_170 + local_248 * fVar80;
      fVar178 = local_1d8 * fVar157 +
                local_1b8 * fVar147 + local_398 * fStack_16c + local_248 * fVar91;
      local_168 = fStack_30c;
      fStack_164 = fStack_30c;
      fStack_160 = fStack_30c;
      fStack_15c = fStack_30c;
      auVar98._0_4_ =
           fStack_30c * fVar104 + fStack_34c * fVar96 + fStack_35c * local_178 + fStack_36c * fVar93
      ;
      auVar98._4_4_ =
           fStack_30c * fVar148 +
           fStack_34c * fVar102 + fStack_35c * fStack_174 + fStack_36c * fVar79;
      auVar98._8_4_ =
           fStack_30c * fVar156 +
           fStack_34c * fVar146 + fStack_35c * fStack_170 + fStack_36c * fVar80;
      auVar98._12_4_ =
           fStack_30c * fVar157 +
           fStack_34c * fVar147 + fStack_35c * fStack_16c + fStack_36c * fVar91;
      fVar203 = fVar213 - fVar185;
      fVar205 = fVar215 - fVar186;
      fVar211 = fVar222 - fVar187;
      fVar212 = fVar223 - fVar190;
      fVar96 = fVar158 - local_328;
      fVar102 = fVar176 - fStack_324;
      fVar146 = fVar177 - fStack_320;
      fVar193 = fVar178 - fStack_31c;
      local_278 = (RTCFilterFunctionN)CONCAT44(fVar186,fVar185);
      uStack_270 = (RTCFilterFunctionN)CONCAT44(fVar190,fVar187);
      fVar194 = local_328 * fVar203 - fVar185 * fVar96;
      fVar195 = fStack_324 * fVar205 - fVar186 * fVar102;
      fVar199 = fStack_320 * fVar211 - fVar187 * fVar146;
      fVar201 = fStack_31c * fVar212 - fVar190 * fVar193;
      auVar183._8_4_ = auStack_3e4._4_4_;
      auVar183._0_8_ = _local_3e8;
      auVar183._12_4_ = fStack_3dc;
      auVar189 = maxps(auVar183,auVar98);
      bVar28 = fVar194 * fVar194 <=
               auVar189._0_4_ * auVar189._0_4_ * (fVar203 * fVar203 + fVar96 * fVar96) &&
               0.0 < fVar48;
      auVar140._0_4_ = -(uint)bVar28;
      bVar29 = fVar195 * fVar195 <=
               auVar189._4_4_ * auVar189._4_4_ * (fVar205 * fVar205 + fVar102 * fVar102) &&
               1.0 < fVar48;
      auVar140._4_4_ = -(uint)bVar29;
      bVar27 = fVar199 * fVar199 <=
               auVar189._8_4_ * auVar189._8_4_ * (fVar211 * fVar211 + fVar146 * fVar146) &&
               2.0 < fVar48;
      auVar140._8_4_ = -(uint)bVar27;
      bVar39 = fVar201 * fVar201 <=
               auVar189._12_4_ * auVar189._12_4_ * (fVar212 * fVar212 + fVar193 * fVar193) &&
               3.0 < fVar48;
      auVar140._12_4_ = -(uint)bVar39;
      local_2d8 = auVar208._0_4_;
      fStack_2d4 = auVar208._4_4_;
      fStack_2d0 = auVar208._8_4_;
      fStack_2cc = auVar208._12_4_;
      local_2d8 = local_2d8 * 4.7683716e-07;
      iVar33 = movmskps(iVar6,auVar140);
      fStack_3b4 = local_3b8;
      fStack_3b0 = local_3b8;
      fStack_3ac = local_3b8;
      fStack_2c4 = local_2c8;
      fStack_2c0 = local_2c8;
      fStack_2bc = local_2c8;
      fStack_254 = local_258;
      fStack_250 = local_258;
      fStack_24c = local_258;
      if (iVar33 == 0) {
        bVar39 = false;
        uVar43 = 0;
        fStack_384 = local_388;
        fStack_380 = local_388;
        fStack_37c = local_388;
      }
      else {
        local_188._0_4_ = auVar14._0_4_;
        local_188._4_4_ = auVar14._4_4_;
        fStack_180 = auVar14._8_4_;
        fVar106 = fVar93 * local_388 + local_178 * local_258 + (float)local_188._0_4_ * local_2c8 +
                  fVar104 * local_3b8;
        fVar116 = fVar79 * local_388 + fStack_174 * local_258 + (float)local_188._4_4_ * local_2c8 +
                  fVar148 * local_3b8;
        fVar119 = fVar80 * local_388 + fStack_170 * local_258 + fStack_180 * local_2c8 +
                  fVar156 * local_3b8;
        fVar121 = fVar91 * local_388 + fStack_16c * local_258 + fVar147 * local_2c8 +
                  fVar157 * local_3b8;
        local_338._0_4_ = auVar13._0_4_;
        local_338._4_4_ = auVar13._4_4_;
        fStack_330 = auVar13._8_4_;
        local_2e8._0_4_ = auVar12._0_4_;
        local_2e8._4_4_ = auVar12._4_4_;
        fStack_2e0 = auVar12._8_4_;
        fVar107 = (float)local_2e8._0_4_ * local_388 + (float)local_338._0_4_ * local_258 +
                  fVar105 * local_2c8 + fVar133 * local_3b8;
        fVar117 = (float)local_2e8._4_4_ * local_388 + (float)local_338._4_4_ * local_258 +
                  fVar115 * local_2c8 + fVar134 * local_3b8;
        fVar120 = fStack_2e0 * local_388 + fStack_330 * local_258 + fVar118 * local_2c8 +
                  fVar135 * local_3b8;
        fVar122 = fVar103 * local_388 + fVar81 * local_258 + fVar123 * local_2c8 +
                  fVar97 * local_3b8;
        fVar93 = *(float *)(catmullrom_basis0 + lVar35 + 0x1210);
        fVar79 = *(float *)(catmullrom_basis0 + lVar35 + 0x1214);
        fVar80 = *(float *)(catmullrom_basis0 + lVar35 + 0x1218);
        fVar81 = *(float *)(catmullrom_basis0 + lVar35 + 0x121c);
        fVar91 = *(float *)(catmullrom_basis0 + lVar35 + 0x1694);
        fVar103 = *(float *)(catmullrom_basis0 + lVar35 + 0x1698);
        fVar105 = *(float *)(catmullrom_basis0 + lVar35 + 0x169c);
        fVar115 = *(float *)(catmullrom_basis0 + lVar35 + 0x16a0);
        fVar118 = *(float *)(catmullrom_basis0 + lVar35 + 0x1b18);
        fVar123 = *(float *)(catmullrom_basis0 + lVar35 + 0x1b1c);
        fVar133 = *(float *)(catmullrom_basis0 + lVar35 + 0x1b20);
        fVar134 = *(float *)(catmullrom_basis0 + lVar35 + 0x1b24);
        fStack_384 = local_388;
        fStack_380 = local_388;
        fStack_37c = local_388;
        fVar135 = *(float *)(catmullrom_basis0 + lVar35 + 0x1f9c);
        fVar97 = *(float *)(catmullrom_basis0 + lVar35 + 0x1fa0);
        fVar147 = *(float *)(catmullrom_basis0 + lVar35 + 0x1fa4);
        fVar104 = *(float *)(catmullrom_basis0 + lVar35 + 0x1fa8);
        _local_2e8 = auVar98;
        fVar196 = local_1c8 * fVar93 +
                  local_268 * fVar91 + local_3c8 * fVar118 + local_3a8 * fVar135;
        fVar200 = local_1c8 * fVar79 +
                  local_268 * fVar103 + local_3c8 * fVar123 + local_3a8 * fVar97;
        fVar202 = local_1c8 * fVar80 +
                  local_268 * fVar105 + local_3c8 * fVar133 + local_3a8 * fVar147;
        fVar204 = local_1c8 * fVar81 +
                  local_268 * fVar115 + local_3c8 * fVar134 + local_3a8 * fVar104;
        fVar231 = local_1d8 * fVar93 +
                  local_1b8 * fVar91 + local_398 * fVar118 + local_248 * fVar135;
        fVar233 = local_1d8 * fVar79 +
                  local_1b8 * fVar103 + local_398 * fVar123 + local_248 * fVar97;
        fVar236 = local_1d8 * fVar80 +
                  local_1b8 * fVar105 + local_398 * fVar133 + local_248 * fVar147;
        fVar239 = local_1d8 * fVar81 +
                  local_1b8 * fVar115 + local_398 * fVar134 + local_248 * fVar104;
        fVar148 = *(float *)(catmullrom_basis1 + lVar35 + 0x1210);
        fVar156 = *(float *)(catmullrom_basis1 + lVar35 + 0x1214);
        fVar157 = *(float *)(catmullrom_basis1 + lVar35 + 0x1218);
        fVar194 = *(float *)(catmullrom_basis1 + lVar35 + 0x121c);
        fVar195 = *(float *)(catmullrom_basis1 + lVar35 + 0x1b18);
        fVar199 = *(float *)(catmullrom_basis1 + lVar35 + 0x1b1c);
        fVar201 = *(float *)(catmullrom_basis1 + lVar35 + 0x1b20);
        fVar214 = *(float *)(catmullrom_basis1 + lVar35 + 0x1b24);
        fVar234 = *(float *)(catmullrom_basis1 + lVar35 + 0x1f9c);
        fVar237 = *(float *)(catmullrom_basis1 + lVar35 + 0x1fa0);
        fVar240 = *(float *)(catmullrom_basis1 + lVar35 + 0x1fa4);
        fVar224 = *(float *)(catmullrom_basis1 + lVar35 + 0x1fa8);
        fVar232 = *(float *)(catmullrom_basis1 + lVar35 + 0x1694);
        fVar235 = *(float *)(catmullrom_basis1 + lVar35 + 0x1698);
        fVar238 = *(float *)(catmullrom_basis1 + lVar35 + 0x169c);
        fVar241 = *(float *)(catmullrom_basis1 + lVar35 + 0x16a0);
        fVar225 = local_1c8 * fVar148 +
                  local_268 * fVar232 + local_3c8 * fVar195 + local_3a8 * fVar234;
        fVar228 = local_1c8 * fVar156 +
                  local_268 * fVar235 + local_3c8 * fVar199 + local_3a8 * fVar237;
        fVar229 = local_1c8 * fVar157 +
                  local_268 * fVar238 + local_3c8 * fVar201 + local_3a8 * fVar240;
        fVar230 = local_1c8 * fVar194 +
                  local_268 * fVar241 + local_3c8 * fVar214 + local_3a8 * fVar224;
        fVar82 = local_1d8 * fVar148 +
                 local_1b8 * fVar232 + local_398 * fVar195 + local_248 * fVar234;
        fVar92 = local_1d8 * fVar156 +
                 local_1b8 * fVar235 + local_398 * fVar199 + local_248 * fVar237;
        fVar94 = local_1d8 * fVar157 +
                 local_1b8 * fVar238 + local_398 * fVar201 + local_248 * fVar240;
        fVar95 = local_1d8 * fVar194 +
                 local_1b8 * fVar241 + local_398 * fVar214 + local_248 * fVar224;
        auVar209._0_8_ = CONCAT44(fVar200,fVar196) & 0x7fffffff7fffffff;
        auVar209._8_4_ = ABS(fVar202);
        auVar209._12_4_ = ABS(fVar204);
        auVar71._0_8_ = CONCAT44(fVar233,fVar231) & 0x7fffffff7fffffff;
        auVar71._8_4_ = ABS(fVar236);
        auVar71._12_4_ = ABS(fVar239);
        auVar189 = maxps(auVar209,auVar71);
        auVar216._0_8_ =
             CONCAT44(fVar79 * local_3b8 +
                      fVar103 * local_2c8 + fVar123 * local_258 + fVar97 * local_388,
                      fVar93 * local_3b8 +
                      fVar91 * local_2c8 + fVar118 * local_258 + fVar135 * local_388) &
             0x7fffffff7fffffff;
        auVar216._8_4_ =
             ABS(fVar80 * local_3b8 +
                 fVar105 * local_2c8 + fVar133 * local_258 + fVar147 * local_388);
        auVar216._12_4_ =
             ABS(fVar81 * local_3b8 +
                 fVar115 * local_2c8 + fVar134 * local_258 + fVar104 * local_388);
        auVar189 = maxps(auVar189,auVar216);
        uVar43 = -(uint)(local_2d8 <= auVar189._0_4_);
        uVar44 = -(uint)(local_2d8 <= auVar189._4_4_);
        uVar45 = -(uint)(local_2d8 <= auVar189._8_4_);
        uVar46 = -(uint)(local_2d8 <= auVar189._12_4_);
        fVar105 = (float)((uint)fVar196 & uVar43 | ~uVar43 & (uint)fVar203);
        fVar115 = (float)((uint)fVar200 & uVar44 | ~uVar44 & (uint)fVar205);
        fVar118 = (float)((uint)fVar202 & uVar45 | ~uVar45 & (uint)fVar211);
        fVar123 = (float)((uint)fVar204 & uVar46 | ~uVar46 & (uint)fVar212);
        fVar133 = (float)(~uVar43 & (uint)fVar96 | (uint)fVar231 & uVar43);
        fVar134 = (float)(~uVar44 & (uint)fVar102 | (uint)fVar233 & uVar44);
        fVar135 = (float)(~uVar45 & (uint)fVar146 | (uint)fVar236 & uVar45);
        fVar97 = (float)(~uVar46 & (uint)fVar193 | (uint)fVar239 & uVar46);
        auVar217._0_8_ = CONCAT44(fVar228,fVar225) & 0x7fffffff7fffffff;
        auVar217._8_4_ = ABS(fVar229);
        auVar217._12_4_ = ABS(fVar230);
        auVar184._0_8_ = CONCAT44(fVar92,fVar82) & 0x7fffffff7fffffff;
        auVar184._8_4_ = ABS(fVar94);
        auVar184._12_4_ = ABS(fVar95);
        auVar189 = maxps(auVar217,auVar184);
        auVar153._0_8_ =
             CONCAT44(fVar156 * local_3b8 +
                      fVar235 * local_2c8 + fVar199 * local_258 + fVar237 * local_388,
                      fVar148 * local_3b8 +
                      fVar232 * local_2c8 + fVar195 * local_258 + fVar234 * local_388) &
             0x7fffffff7fffffff;
        auVar153._8_4_ =
             ABS(fVar157 * local_3b8 +
                 fVar238 * local_2c8 + fVar201 * local_258 + fVar240 * local_388);
        auVar153._12_4_ =
             ABS(fVar194 * local_3b8 +
                 fVar241 * local_2c8 + fVar214 * local_258 + fVar224 * local_388);
        auVar189 = maxps(auVar189,auVar153);
        uVar43 = -(uint)(local_2d8 <= auVar189._0_4_);
        uVar44 = -(uint)(local_2d8 <= auVar189._4_4_);
        uVar45 = -(uint)(local_2d8 <= auVar189._8_4_);
        uVar46 = -(uint)(local_2d8 <= auVar189._12_4_);
        fVar203 = (float)((uint)fVar225 & uVar43 | ~uVar43 & (uint)fVar203);
        fVar205 = (float)((uint)fVar228 & uVar44 | ~uVar44 & (uint)fVar205);
        fVar211 = (float)((uint)fVar229 & uVar45 | ~uVar45 & (uint)fVar211);
        fVar214 = (float)((uint)fVar230 & uVar46 | ~uVar46 & (uint)fVar212);
        auVar87._0_4_ = (uint)fVar82 & uVar43;
        auVar87._4_4_ = (uint)fVar92 & uVar44;
        auVar87._8_4_ = (uint)fVar94 & uVar45;
        auVar87._12_4_ = (uint)fVar95 & uVar46;
        auVar218._0_4_ = ~uVar43 & (uint)fVar96;
        auVar218._4_4_ = ~uVar44 & (uint)fVar102;
        auVar218._8_4_ = ~uVar45 & (uint)fVar146;
        auVar218._12_4_ = ~uVar46 & (uint)fVar193;
        auVar218 = auVar218 | auVar87;
        auVar72._0_4_ = fVar133 * fVar133 + fVar105 * fVar105;
        auVar72._4_4_ = fVar134 * fVar134 + fVar115 * fVar115;
        auVar72._8_4_ = fVar135 * fVar135 + fVar118 * fVar118;
        auVar72._12_4_ = fVar97 * fVar97 + fVar123 * fVar123;
        auVar189 = rsqrtps(auVar87,auVar72);
        fVar93 = auVar189._0_4_;
        fVar79 = auVar189._4_4_;
        fVar80 = auVar189._8_4_;
        fVar81 = auVar189._12_4_;
        auVar88._0_4_ = fVar93 * fVar93 * auVar72._0_4_ * 0.5 * fVar93;
        auVar88._4_4_ = fVar79 * fVar79 * auVar72._4_4_ * 0.5 * fVar79;
        auVar88._8_4_ = fVar80 * fVar80 * auVar72._8_4_ * 0.5 * fVar80;
        auVar88._12_4_ = fVar81 * fVar81 * auVar72._12_4_ * 0.5 * fVar81;
        fVar201 = fVar93 * 1.5 - auVar88._0_4_;
        fVar234 = fVar79 * 1.5 - auVar88._4_4_;
        fVar237 = fVar80 * 1.5 - auVar88._8_4_;
        fVar240 = fVar81 * 1.5 - auVar88._12_4_;
        fVar96 = auVar218._0_4_;
        fVar194 = auVar218._4_4_;
        fVar195 = auVar218._8_4_;
        fVar199 = auVar218._12_4_;
        auVar73._0_4_ = fVar96 * fVar96 + fVar203 * fVar203;
        auVar73._4_4_ = fVar194 * fVar194 + fVar205 * fVar205;
        auVar73._8_4_ = fVar195 * fVar195 + fVar211 * fVar211;
        auVar73._12_4_ = fVar199 * fVar199 + fVar214 * fVar214;
        auVar189 = rsqrtps(auVar88,auVar73);
        fVar93 = auVar189._0_4_;
        fVar79 = auVar189._4_4_;
        fVar80 = auVar189._8_4_;
        fVar81 = auVar189._12_4_;
        fVar91 = fVar93 * 1.5 - fVar93 * fVar93 * auVar73._0_4_ * 0.5 * fVar93;
        fVar102 = fVar79 * 1.5 - fVar79 * fVar79 * auVar73._4_4_ * 0.5 * fVar79;
        fVar80 = fVar80 * 1.5 - fVar80 * fVar80 * auVar73._8_4_ * 0.5 * fVar80;
        fVar103 = fVar81 * 1.5 - fVar81 * fVar81 * auVar73._12_4_ * 0.5 * fVar81;
        fVar147 = fVar133 * fVar201 * fVar191;
        fVar148 = fVar134 * fVar234 * fVar192;
        fVar157 = fVar135 * fVar237 * (float)auStack_3e4._4_4_;
        fVar212 = fVar97 * fVar240 * fStack_3dc;
        fVar146 = -fVar105 * fVar201 * fVar191;
        fVar104 = -fVar115 * fVar234 * fVar192;
        fVar156 = -fVar118 * fVar237 * (float)auStack_3e4._4_4_;
        fVar193 = -fVar123 * fVar240 * fStack_3dc;
        _local_338 = auVar140;
        local_288 = local_328 + fVar146;
        fStack_284 = fStack_324 + fVar104;
        fStack_280 = fStack_320 + fVar156;
        aStack_27c = (anon_struct_4_6_abad0318_for_Geometry_10)(fStack_31c + fVar193);
        fVar232 = fVar201 * 0.0 * fVar191;
        fVar235 = fVar234 * 0.0 * fVar192;
        fVar238 = fVar237 * 0.0 * (float)auStack_3e4._4_4_;
        fVar241 = fVar240 * 0.0 * fStack_3dc;
        local_348 = fVar107 + fVar232;
        fStack_344 = fVar117 + fVar235;
        fStack_340 = fVar120 + fVar238;
        fStack_33c = fVar122 + fVar241;
        fVar234 = fVar96 * fVar91 * auVar98._0_4_;
        fVar237 = fVar194 * fVar102 * auVar98._4_4_;
        fVar240 = fVar195 * fVar80 * auVar98._8_4_;
        fVar224 = fVar199 * fVar103 * auVar98._12_4_;
        fVar194 = fVar213 + fVar234;
        fVar195 = fVar215 + fVar237;
        fVar199 = fVar222 + fVar240;
        fVar201 = fVar223 + fVar224;
        fVar133 = -fVar203 * fVar91 * auVar98._0_4_;
        fVar134 = -fVar205 * fVar102 * auVar98._4_4_;
        fVar135 = -fVar211 * fVar80 * auVar98._8_4_;
        fVar97 = -fVar214 * fVar103 * auVar98._12_4_;
        fVar93 = fVar158 + fVar133;
        fVar79 = fVar176 + fVar134;
        fVar81 = fVar177 + fVar135;
        fVar96 = fVar178 + fVar97;
        fVar105 = fVar91 * 0.0 * auVar98._0_4_;
        fVar115 = fVar102 * 0.0 * auVar98._4_4_;
        fVar118 = fVar80 * 0.0 * auVar98._8_4_;
        fVar123 = fVar103 * 0.0 * auVar98._12_4_;
        fVar80 = fVar185 - fVar147;
        fVar91 = fVar186 - fVar148;
        fVar102 = fVar187 - fVar157;
        fVar103 = fVar190 - fVar212;
        fVar203 = fVar106 + fVar105;
        fVar205 = fVar116 + fVar115;
        fVar211 = fVar119 + fVar118;
        fVar214 = fVar121 + fVar123;
        fVar146 = local_328 - fVar146;
        fVar104 = fStack_324 - fVar104;
        fVar156 = fStack_320 - fVar156;
        fVar193 = fStack_31c - fVar193;
        fVar107 = fVar107 - fVar232;
        fVar117 = fVar117 - fVar235;
        fVar120 = fVar120 - fVar238;
        fVar122 = fVar122 - fVar241;
        uVar43 = -(uint)(0.0 < (fVar146 * (fVar203 - fVar107) - fVar107 * (fVar93 - fVar146)) * 0.0
                               + (fVar107 * (fVar194 - fVar80) - (fVar203 - fVar107) * fVar80) * 0.0
                                 + ((fVar93 - fVar146) * fVar80 - (fVar194 - fVar80) * fVar146));
        uVar44 = -(uint)(0.0 < (fVar104 * (fVar205 - fVar117) - fVar117 * (fVar79 - fVar104)) * 0.0
                               + (fVar117 * (fVar195 - fVar91) - (fVar205 - fVar117) * fVar91) * 0.0
                                 + ((fVar79 - fVar104) * fVar91 - (fVar195 - fVar91) * fVar104));
        uVar45 = -(uint)(0.0 < (fVar156 * (fVar211 - fVar120) - fVar120 * (fVar81 - fVar156)) * 0.0
                               + (fVar120 * (fVar199 - fVar102) - (fVar211 - fVar120) * fVar102) *
                                 0.0 + ((fVar81 - fVar156) * fVar102 - (fVar199 - fVar102) * fVar156
                                       ));
        uVar46 = -(uint)(0.0 < (fVar193 * (fVar214 - fVar122) - fVar122 * (fVar96 - fVar193)) * 0.0
                               + (fVar122 * (fVar201 - fVar103) - (fVar214 - fVar122) * fVar103) *
                                 0.0 + ((fVar96 - fVar193) * fVar103 - (fVar201 - fVar103) * fVar193
                                       ));
        fVar185 = (float)((uint)(fVar213 - fVar234) & uVar43 | ~uVar43 & (uint)(fVar185 + fVar147));
        fVar186 = (float)((uint)(fVar215 - fVar237) & uVar44 | ~uVar44 & (uint)(fVar186 + fVar148));
        fStack_3f0 = (float)((uint)(fVar222 - fVar240) & uVar45 |
                            ~uVar45 & (uint)(fVar187 + fVar157));
        fStack_3ec = (float)((uint)(fVar223 - fVar224) & uVar46 |
                            ~uVar46 & (uint)(fVar190 + fVar212));
        local_408._0_4_ = (float)((uint)(fVar158 - fVar133) & uVar43 | ~uVar43 & (uint)local_288);
        local_408._4_4_ = (float)((uint)(fVar176 - fVar134) & uVar44 | ~uVar44 & (uint)fStack_284);
        uStack_400._0_4_ = (float)((uint)(fVar177 - fVar135) & uVar45 | ~uVar45 & (uint)fStack_280);
        uStack_400._4_4_ = (float)((uint)(fVar178 - fVar97) & uVar46 | ~uVar46 & (uint)aStack_27c);
        fVar212 = (float)((uint)(fVar106 - fVar105) & uVar43 | ~uVar43 & (uint)local_348);
        fVar213 = (float)((uint)(fVar116 - fVar115) & uVar44 | ~uVar44 & (uint)fStack_344);
        fStack_420 = (float)((uint)(fVar119 - fVar118) & uVar45 | ~uVar45 & (uint)fStack_340);
        fStack_41c = (float)((uint)(fVar121 - fVar123) & uVar46 | ~uVar46 & (uint)fStack_33c);
        fVar105 = (float)((uint)fVar80 & uVar43 | ~uVar43 & (uint)fVar194);
        fVar115 = (float)((uint)fVar91 & uVar44 | ~uVar44 & (uint)fVar195);
        fVar118 = (float)((uint)fVar102 & uVar45 | ~uVar45 & (uint)fVar199);
        fVar123 = (float)((uint)fVar103 & uVar46 | ~uVar46 & (uint)fVar201);
        fVar147 = (float)((uint)fVar146 & uVar43 | ~uVar43 & (uint)fVar93);
        fVar148 = (float)((uint)fVar104 & uVar44 | ~uVar44 & (uint)fVar79);
        fVar157 = (float)((uint)fVar156 & uVar45 | ~uVar45 & (uint)fVar81);
        fVar158 = (float)((uint)fVar193 & uVar46 | ~uVar46 & (uint)fVar96);
        fVar133 = (float)((uint)fVar107 & uVar43 | ~uVar43 & (uint)fVar203);
        fVar134 = (float)((uint)fVar117 & uVar44 | ~uVar44 & (uint)fVar205);
        fVar135 = (float)((uint)fVar120 & uVar45 | ~uVar45 & (uint)fVar211);
        fVar97 = (float)((uint)fVar122 & uVar46 | ~uVar46 & (uint)fVar214);
        fVar177 = (float)((uint)fVar194 & uVar43 | ~uVar43 & (uint)fVar80) - fVar185;
        fVar178 = (float)((uint)fVar195 & uVar44 | ~uVar44 & (uint)fVar91) - fVar186;
        fVar187 = (float)((uint)fVar199 & uVar45 | ~uVar45 & (uint)fVar102) - fStack_3f0;
        fVar190 = (float)((uint)fVar201 & uVar46 | ~uVar46 & (uint)fVar103) - fStack_3ec;
        fVar93 = (float)((uint)fVar93 & uVar43 | ~uVar43 & (uint)fVar146) - (float)local_408;
        fVar80 = (float)((uint)fVar79 & uVar44 | ~uVar44 & (uint)fVar104) - local_408._4_4_;
        fVar91 = (float)((uint)fVar81 & uVar45 | ~uVar45 & (uint)fVar156) - (float)uStack_400;
        fVar102 = (float)((uint)fVar96 & uVar46 | ~uVar46 & (uint)fVar193) - uStack_400._4_4_;
        fVar193 = (float)((uint)fVar203 & uVar43 | ~uVar43 & (uint)fVar107) - fVar212;
        fVar194 = (float)((uint)fVar205 & uVar44 | ~uVar44 & (uint)fVar117) - fVar213;
        fVar195 = (float)((uint)fVar211 & uVar45 | ~uVar45 & (uint)fVar120) - fStack_420;
        fVar199 = (float)((uint)fVar214 & uVar46 | ~uVar46 & (uint)fVar122) - fStack_41c;
        fVar215 = fVar185 - fVar105;
        fVar222 = fVar186 - fVar115;
        fVar223 = fStack_3f0 - fVar118;
        fVar214 = fStack_3ec - fVar123;
        fVar146 = (float)local_408 - fVar147;
        fVar104 = local_408._4_4_ - fVar148;
        fVar156 = (float)uStack_400 - fVar157;
        fVar176 = uStack_400._4_4_ - fVar158;
        local_428 = CONCAT44(fVar213,fVar212);
        fVar79 = fVar212 - fVar133;
        fVar81 = fVar213 - fVar134;
        fVar96 = fStack_420 - fVar135;
        fVar103 = fStack_41c - fVar97;
        fVar201 = ((float)local_408 * fVar193 - fVar212 * fVar93) * 0.0 +
                  (fVar212 * fVar177 - fVar185 * fVar193) * 0.0 +
                  (fVar185 * fVar93 - (float)local_408 * fVar177);
        fVar203 = (local_408._4_4_ * fVar194 - fVar213 * fVar80) * 0.0 +
                  (fVar213 * fVar178 - fVar186 * fVar194) * 0.0 +
                  (fVar186 * fVar80 - local_408._4_4_ * fVar178);
        auVar111._4_4_ = fVar203;
        auVar111._0_4_ = fVar201;
        fVar205 = ((float)uStack_400 * fVar195 - fStack_420 * fVar91) * 0.0 +
                  (fStack_420 * fVar187 - fStack_3f0 * fVar195) * 0.0 +
                  (fStack_3f0 * fVar91 - (float)uStack_400 * fVar187);
        fVar211 = (uStack_400._4_4_ * fVar199 - fStack_41c * fVar102) * 0.0 +
                  (fStack_41c * fVar190 - fStack_3ec * fVar199) * 0.0 +
                  (fStack_3ec * fVar102 - uStack_400._4_4_ * fVar190);
        auVar226._0_4_ =
             (fVar147 * fVar79 - fVar133 * fVar146) * 0.0 +
             (fVar133 * fVar215 - fVar105 * fVar79) * 0.0 + (fVar105 * fVar146 - fVar147 * fVar215);
        auVar226._4_4_ =
             (fVar148 * fVar81 - fVar134 * fVar104) * 0.0 +
             (fVar134 * fVar222 - fVar115 * fVar81) * 0.0 + (fVar115 * fVar104 - fVar148 * fVar222);
        auVar226._8_4_ =
             (fVar157 * fVar96 - fVar135 * fVar156) * 0.0 +
             (fVar135 * fVar223 - fVar118 * fVar96) * 0.0 + (fVar118 * fVar156 - fVar157 * fVar223);
        auVar226._12_4_ =
             (fVar158 * fVar103 - fVar97 * fVar176) * 0.0 +
             (fVar97 * fVar214 - fVar123 * fVar103) * 0.0 + (fVar123 * fVar176 - fVar158 * fVar214);
        auVar111._8_4_ = fVar205;
        auVar111._12_4_ = fVar211;
        auVar189 = maxps(auVar111,auVar226);
        bVar28 = auVar189._0_4_ <= 0.0 && bVar28;
        auVar112._0_4_ = -(uint)bVar28;
        bVar29 = auVar189._4_4_ <= 0.0 && bVar29;
        auVar112._4_4_ = -(uint)bVar29;
        bVar27 = auVar189._8_4_ <= 0.0 && bVar27;
        auVar112._8_4_ = -(uint)bVar27;
        bVar39 = auVar189._12_4_ <= 0.0 && bVar39;
        auVar112._12_4_ = -(uint)bVar39;
        iVar33 = movmskps(iVar33,auVar112);
        if (iVar33 == 0) {
LAB_00a86691:
          auVar75._8_8_ = uStack_2f0;
          auVar75._0_8_ = local_2f8;
        }
        else {
          local_278 = *(RTCFilterFunctionN *)&local_3d0->tfar;
          p_Var8 = local_278;
          uStack_270 = *(RTCFilterFunctionN *)&local_3d0->id;
          auVar74._0_4_ = fVar79 * fVar93;
          auVar74._4_4_ = fVar81 * fVar80;
          auVar74._8_4_ = fVar96 * fVar91;
          auVar74._12_4_ = fVar103 * fVar102;
          fVar118 = fVar146 * fVar193 - auVar74._0_4_;
          fVar123 = fVar104 * fVar194 - auVar74._4_4_;
          fVar133 = fVar156 * fVar195 - auVar74._8_4_;
          fVar134 = fVar176 * fVar199 - auVar74._12_4_;
          fVar105 = fVar79 * fVar177 - fVar193 * fVar215;
          fVar115 = fVar81 * fVar178 - fVar194 * fVar222;
          fVar96 = fVar96 * fVar187 - fVar195 * fVar223;
          fVar103 = fVar103 * fVar190 - fVar199 * fVar214;
          fVar135 = fVar215 * fVar93 - fVar146 * fVar177;
          fVar97 = fVar222 * fVar80 - fVar104 * fVar178;
          fVar146 = fVar223 * fVar91 - fVar156 * fVar187;
          fVar147 = fVar214 * fVar102 - fVar176 * fVar190;
          auVar141._0_4_ = fVar118 * 0.0 + fVar105 * 0.0 + fVar135;
          auVar141._4_4_ = fVar123 * 0.0 + fVar115 * 0.0 + fVar97;
          auVar141._8_4_ = fVar133 * 0.0 + fVar96 * 0.0 + fVar146;
          auVar141._12_4_ = fVar134 * 0.0 + fVar103 * 0.0 + fVar147;
          auVar189 = rcpps(auVar74,auVar141);
          fVar93 = auVar189._0_4_;
          fVar79 = auVar189._4_4_;
          fVar80 = auVar189._8_4_;
          fVar81 = auVar189._12_4_;
          fVar93 = (1.0 - auVar141._0_4_ * fVar93) * fVar93 + fVar93;
          fVar79 = (1.0 - auVar141._4_4_ * fVar79) * fVar79 + fVar79;
          fVar80 = (1.0 - auVar141._8_4_ * fVar80) * fVar80 + fVar80;
          fVar81 = (1.0 - auVar141._12_4_ * fVar81) * fVar81 + fVar81;
          fVar91 = (fVar212 * fVar135 + (float)local_408 * fVar105 + fVar185 * fVar118) * fVar93;
          fVar102 = (fVar213 * fVar97 + local_408._4_4_ * fVar115 + fVar186 * fVar123) * fVar79;
          auVar154._4_4_ = fVar102;
          auVar154._0_4_ = fVar91;
          fVar96 = (fStack_420 * fVar146 + (float)uStack_400 * fVar96 + fStack_3f0 * fVar133) *
                   fVar80;
          fVar103 = (fStack_41c * fVar147 + uStack_400._4_4_ * fVar103 + fStack_3ec * fVar134) *
                    fVar81;
          local_278._0_4_ = SUB84(*(RTCFilterFunctionN *)&local_3d0->tfar,0);
          bVar28 = (fStack_1dc <= fVar91 && fVar91 <= (float)local_278) && bVar28;
          auVar127._0_4_ = -(uint)bVar28;
          bVar29 = (fStack_1dc <= fVar102 && fVar102 <= (float)local_278) && bVar29;
          auVar127._4_4_ = -(uint)bVar29;
          bVar27 = (fStack_1dc <= fVar96 && fVar96 <= (float)local_278) && bVar27;
          auVar127._8_4_ = -(uint)bVar27;
          bVar39 = (fStack_1dc <= fVar103 && fVar103 <= (float)local_278) && bVar39;
          auVar127._12_4_ = -(uint)bVar39;
          iVar33 = movmskps(iVar33,auVar127);
          local_278 = p_Var8;
          if (iVar33 == 0) goto LAB_00a86691;
          auVar128._0_8_ =
               CONCAT44(-(uint)(auVar141._4_4_ != 0.0 && bVar29),
                        -(uint)(auVar141._0_4_ != 0.0 && bVar28));
          auVar128._8_4_ = -(uint)(auVar141._8_4_ != 0.0 && bVar27);
          auVar128._12_4_ = -(uint)(auVar141._12_4_ != 0.0 && bVar39);
          iVar33 = movmskps(iVar33,auVar128);
          auVar75._8_8_ = uStack_2f0;
          auVar75._0_8_ = local_2f8;
          if (iVar33 != 0) {
            fVar201 = fVar201 * fVar93;
            fVar203 = fVar203 * fVar79;
            fVar205 = fVar205 * fVar80;
            fVar211 = fVar211 * fVar81;
            local_438 = (float)((uint)(1.0 - fVar201) & uVar43 | ~uVar43 & (uint)fVar201);
            fStack_434 = (float)((uint)(1.0 - fVar203) & uVar44 | ~uVar44 & (uint)fVar203);
            fStack_430 = (float)((uint)(1.0 - fVar205) & uVar45 | ~uVar45 & (uint)fVar205);
            fStack_42c = (float)((uint)(1.0 - fVar211) & uVar46 | ~uVar46 & (uint)fVar211);
            auVar75._8_4_ = auVar128._8_4_;
            auVar75._0_8_ = auVar128._0_8_;
            auVar75._12_4_ = auVar128._12_4_;
            auVar154._8_4_ = fVar96;
            auVar154._12_4_ = fVar103;
            local_198 = (float)(~uVar43 & (uint)(auVar226._0_4_ * fVar93) |
                               (uint)(1.0 - auVar226._0_4_ * fVar93) & uVar43);
            fStack_194 = (float)(~uVar44 & (uint)(auVar226._4_4_ * fVar79) |
                                (uint)(1.0 - auVar226._4_4_ * fVar79) & uVar44);
            fStack_190 = (float)(~uVar45 & (uint)(auVar226._8_4_ * fVar80) |
                                (uint)(1.0 - auVar226._8_4_ * fVar80) & uVar45);
            fStack_18c = (float)(~uVar46 & (uint)(auVar226._12_4_ * fVar81) |
                                (uint)(1.0 - auVar226._12_4_ * fVar81) & uVar46);
            local_448 = auVar154;
          }
        }
        uVar43 = movmskps(iVar33,auVar75);
        if (uVar43 != 0) {
          fVar191 = (auVar98._0_4_ - fVar191) * local_438 + fVar191;
          fVar192 = (auVar98._4_4_ - fVar192) * fStack_434 + fVar192;
          fVar79 = (auVar98._8_4_ - (float)auStack_3e4._4_4_) * fStack_430 +
                   (float)auStack_3e4._4_4_;
          fVar80 = (auVar98._12_4_ - fStack_3dc) * fStack_42c + fStack_3dc;
          fVar93 = local_3d8->depth_scale;
          local_a8._0_4_ = -(uint)(fVar93 * (fVar191 + fVar191) < local_448._0_4_) & auVar75._0_4_;
          local_a8._4_4_ = -(uint)(fVar93 * (fVar192 + fVar192) < local_448._4_4_) & auVar75._4_4_;
          local_a8._8_4_ = -(uint)(fVar93 * (fVar79 + fVar79) < local_448._8_4_) & auVar75._8_4_;
          local_a8._12_4_ = -(uint)(fVar93 * (fVar80 + fVar80) < local_448._12_4_) & auVar75._12_4_;
          uVar43 = movmskps(uVar43,local_a8);
          if (uVar43 != 0) {
            local_198 = local_198 + local_198 + -1.0;
            fStack_194 = fStack_194 + fStack_194 + -1.0;
            fStack_190 = fStack_190 + fStack_190 + -1.0;
            fStack_18c = fStack_18c + fStack_18c + -1.0;
            local_128 = local_438;
            fStack_124 = fStack_434;
            fStack_120 = fStack_430;
            fStack_11c = fStack_42c;
            local_118 = local_198;
            fStack_114 = fStack_194;
            fStack_110 = fStack_190;
            fStack_10c = fStack_18c;
            local_108 = local_448;
            local_f8 = 0;
            local_f4 = iVar6;
            local_e8 = local_318;
            fStack_e4 = fStack_314;
            fStack_e0 = fStack_310;
            fStack_dc = fStack_30c;
            local_d8 = local_358;
            fStack_d4 = fStack_354;
            fStack_d0 = fStack_350;
            fStack_cc = fStack_34c;
            local_c8 = local_368;
            fStack_c4 = fStack_364;
            fStack_c0 = fStack_360;
            fStack_bc = fStack_35c;
            local_b8 = local_378;
            fStack_b4 = fStack_374;
            fStack_b0 = fStack_370;
            fStack_ac = fStack_36c;
            if ((pGVar7->mask & local_3d0->mask) != 0) {
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (bVar39 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar48 = 1.0 / fVar48;
                local_98[0] = fVar48 * (local_438 + 0.0);
                local_98[1] = fVar48 * (fStack_434 + 1.0);
                local_98[2] = fVar48 * (fStack_430 + 2.0);
                local_98[3] = fVar48 * (fStack_42c + 3.0);
                local_88 = CONCAT44(fStack_194,local_198);
                uStack_80 = CONCAT44(fStack_18c,fStack_190);
                local_78 = local_448;
                local_3f8 = (Geometry *)(ulong)(byte)uVar43;
                local_428 = 0;
                if (local_3f8 != (Geometry *)0x0) {
                  for (; ((byte)uVar43 >> local_428 & 1) == 0; local_428 = local_428 + 1) {
                  }
                }
                local_408._0_4_ = local_3d0->tfar;
                _local_188 = auVar59;
                do {
                  local_22c = local_98[local_428];
                  local_228 = *(undefined4 *)((long)&local_88 + local_428 * 4);
                  local_3d0->tfar = *(float *)(local_78 + local_428 * 4);
                  fVar93 = 1.0 - local_22c;
                  fVar79 = local_22c * 3.0;
                  fVar80 = ((fVar79 + 2.0) * (fVar93 + fVar93) + fVar93 * -3.0 * fVar93) * 0.5;
                  fVar48 = (fVar93 * -2.0 * local_22c + local_22c * local_22c) * 0.5;
                  fVar79 = (local_22c * fVar79 + (fVar79 + -5.0) * (local_22c + local_22c)) * 0.5;
                  fVar93 = (local_22c * (fVar93 + fVar93) - fVar93 * fVar93) * 0.5;
                  local_2b8._16_8_ = context->user;
                  local_238 = CONCAT44(fVar93 * fStack_314 +
                                       fVar79 * fStack_354 +
                                       fVar80 * fStack_364 + fVar48 * fStack_374,
                                       fVar93 * local_318 +
                                       fVar79 * local_358 + fVar80 * local_368 + fVar48 * local_378)
                  ;
                  local_230 = fVar93 * fStack_310 +
                              fVar79 * fStack_350 + fVar80 * fStack_360 + fVar48 * fStack_370;
                  local_224 = (int)local_200;
                  local_220 = (int)local_300;
                  local_21c = *(uint *)&(((Device *)local_2b8._16_8_)->super_State).super_RefCount.
                                        _vptr_RefCount;
                  local_218 = *(uint *)((long)&(((Device *)local_2b8._16_8_)->super_State).
                                               super_RefCount._vptr_RefCount + 4);
                  local_45c = 0xffffffff;
                  local_2b8._0_8_ = &local_45c;
                  local_2b8._8_8_ = pGVar7->userPtr;
                  local_2b8._24_8_ = local_3d0;
                  local_2b8._32_8_ = &local_238;
                  local_290 = 1.4013e-45;
                  if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00a8653c:
                    pp_Var37 = (_func_int **)context->args->filter;
                    if ((pp_Var37 != (_func_int **)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
                      pGVar40 = (Geometry *)local_2b8;
                      (*(code *)pp_Var37)((RTCFilterFunctionNArguments *)pGVar40);
                      pp_Var37 = (_func_int **)local_2b8._0_8_;
                      if (*(int *)local_2b8._0_8_ == 0) goto LAB_00a8657e;
                    }
                    uVar43 = (uint)pp_Var37;
                    bVar39 = true;
                    goto LAB_00a8663a;
                  }
                  pGVar40 = (Geometry *)local_2b8;
                  (*pGVar7->occlusionFilterN)((RTCFilterFunctionNArguments *)pGVar40);
                  if (*(int *)local_2b8._0_8_ != 0) goto LAB_00a8653c;
LAB_00a8657e:
                  local_3d0->tfar = (float)local_408;
                  local_3f8 = (Geometry *)((ulong)local_3f8 ^ 1L << (local_428 & 0x3f));
                  local_428 = 0;
                  if (local_3f8 != (Geometry *)0x0) {
                    for (; ((ulong)local_3f8 >> local_428 & 1) == 0; local_428 = local_428 + 1) {
                    }
                  }
                  bVar39 = false;
                  pGVar40 = local_3f8;
                } while (local_3f8 != (Geometry *)0x0);
                uVar43 = 0;
              }
              goto LAB_00a8663a;
            }
          }
        }
        bVar39 = false;
      }
LAB_00a8663a:
      if (4 < iVar6) {
        local_58 = iVar6;
        iStack_54 = iVar6;
        iStack_50 = iVar6;
        iStack_4c = iVar6;
        fStack_2d4 = local_2d8;
        fStack_2d0 = local_2d8;
        fStack_2cc = local_2d8;
        local_1e8 = fStack_1dc;
        fStack_1e4 = fStack_1dc;
        fStack_1e0 = fStack_1dc;
        local_68 = 1.0 / (float)local_1f8._0_4_;
        fStack_64 = local_68;
        fStack_60 = local_68;
        fStack_5c = local_68;
        lVar41 = 4;
        fVar93 = local_398;
        fVar48 = fStack_394;
        fVar79 = fStack_390;
        fVar80 = fStack_38c;
        do {
          local_f8 = (uint)lVar41;
          pfVar1 = (float *)(catmullrom_basis0 + lVar41 * 4 + lVar35);
          local_348 = *pfVar1;
          fStack_344 = pfVar1[1];
          fStack_340 = pfVar1[2];
          fStack_33c = pfVar1[3];
          pfVar1 = (float *)(lVar35 + 0x21b37f0 + lVar41 * 4);
          local_288 = *pfVar1;
          fStack_284 = pfVar1[1];
          fStack_280 = pfVar1[2];
          aStack_27c = *(anon_struct_4_6_abad0318_for_Geometry_10 *)(pfVar1 + 3);
          pfVar1 = (float *)(lVar35 + 0x21b3c74 + lVar41 * 4);
          local_178 = *pfVar1;
          fStack_174 = pfVar1[1];
          fStack_170 = pfVar1[2];
          fStack_16c = pfVar1[3];
          pfVar1 = (float *)(lVar35 + 0x21b40f8 + lVar41 * 4);
          fVar81 = *pfVar1;
          fVar91 = pfVar1[1];
          fVar96 = pfVar1[2];
          fVar102 = pfVar1[3];
          local_338._0_4_ =
               local_1c8 * local_348 +
               local_268 * local_288 + local_3c8 * local_178 + local_3a8 * fVar81;
          local_338._4_4_ =
               fStack_1c4 * fStack_344 +
               fStack_264 * fStack_284 + fStack_3c4 * fStack_174 + fStack_3a4 * fVar91;
          fStack_330 = fStack_1c0 * fStack_340 +
                       fStack_260 * fStack_280 + fStack_3c0 * fStack_170 + fStack_3a0 * fVar96;
          fStack_32c = fStack_1bc * fStack_33c +
                       fStack_25c * (float)aStack_27c +
                       fStack_3bc * fStack_16c + fStack_39c * fVar102;
          fVar186 = local_1d8 * local_348 +
                    local_1b8 * local_288 + fVar93 * local_178 + local_248 * fVar81;
          fVar190 = fStack_1d4 * fStack_344 +
                    fStack_1b4 * fStack_284 + fVar48 * fStack_174 + fStack_244 * fVar91;
          fVar192 = fStack_1d0 * fStack_340 +
                    fStack_1b0 * fStack_280 + fVar79 * fStack_170 + fStack_240 * fVar96;
          fVar194 = fStack_1cc * fStack_33c +
                    fStack_1ac * (float)aStack_27c + fVar80 * fStack_16c + fStack_23c * fVar102;
          auVar90._0_4_ =
               local_168 * local_348 +
               local_158 * local_288 + local_138 * local_178 + local_148 * fVar81;
          auVar90._4_4_ =
               fStack_164 * fStack_344 +
               fStack_154 * fStack_284 + fStack_134 * fStack_174 + fStack_144 * fVar91;
          auVar90._8_4_ =
               fStack_160 * fStack_340 +
               fStack_150 * fStack_280 + fStack_130 * fStack_170 + fStack_140 * fVar96;
          auVar90._12_4_ =
               fStack_15c * fStack_33c +
               fStack_14c * (float)aStack_27c + fStack_12c * fStack_16c + fStack_13c * fVar102;
          puVar36 = catmullrom_basis1 + lVar35;
          uVar9 = *(undefined8 *)(puVar36 + lVar41 * 4);
          uVar10 = *(undefined8 *)((long)(puVar36 + lVar41 * 4) + 8);
          pfVar1 = (float *)(lVar35 + 0x21b5c10 + lVar41 * 4);
          fVar103 = *pfVar1;
          fVar105 = pfVar1[1];
          fVar115 = pfVar1[2];
          fVar118 = pfVar1[3];
          pfVar1 = (float *)(lVar35 + 0x21b6094 + lVar41 * 4);
          fVar123 = *pfVar1;
          fVar133 = pfVar1[1];
          fVar134 = pfVar1[2];
          fVar135 = pfVar1[3];
          pfVar1 = (float *)(lVar35 + 0x21b6518 + lVar41 * 4);
          fVar97 = *pfVar1;
          fVar146 = pfVar1[1];
          fVar147 = pfVar1[2];
          fVar104 = pfVar1[3];
          local_3e8 = SUB84(uVar9,0);
          auStack_3e4._0_4_ = (undefined4)((ulong)uVar9 >> 0x20);
          auStack_3e4._4_4_ = (undefined4)uVar10;
          fStack_3dc = (float)((ulong)uVar10 >> 0x20);
          local_2e8._0_4_ =
               local_1c8 * (float)local_3e8 +
               local_268 * fVar103 + local_3c8 * fVar123 + local_3a8 * fVar97;
          local_2e8._4_4_ =
               fStack_1c4 * (float)auStack_3e4._0_4_ +
               fStack_264 * fVar105 + fStack_3c4 * fVar133 + fStack_3a4 * fVar146;
          fStack_2e0 = fStack_1c0 * (float)auStack_3e4._4_4_ +
                       fStack_260 * fVar115 + fStack_3c0 * fVar134 + fStack_3a0 * fVar147;
          fStack_2dc = fStack_1bc * fStack_3dc +
                       fStack_25c * fVar118 + fStack_3bc * fVar135 + fStack_39c * fVar104;
          fVar176 = local_1d8 * (float)local_3e8 +
                    local_1b8 * fVar103 + fVar93 * fVar123 + local_248 * fVar97;
          fVar177 = fStack_1d4 * (float)auStack_3e4._0_4_ +
                    fStack_1b4 * fVar105 + fVar48 * fVar133 + fStack_244 * fVar146;
          fVar178 = fStack_1d0 * (float)auStack_3e4._4_4_ +
                    fStack_1b0 * fVar115 + fVar79 * fVar134 + fStack_240 * fVar147;
          fVar185 = fStack_1cc * fStack_3dc +
                    fStack_1ac * fVar118 + fVar80 * fVar135 + fStack_23c * fVar104;
          auVar219._0_4_ =
               local_168 * (float)local_3e8 +
               local_158 * fVar103 + local_138 * fVar123 + local_148 * fVar97;
          auVar219._4_4_ =
               fStack_164 * (float)auStack_3e4._0_4_ +
               fStack_154 * fVar105 + fStack_134 * fVar133 + fStack_144 * fVar146;
          auVar219._8_4_ =
               fStack_160 * (float)auStack_3e4._4_4_ +
               fStack_150 * fVar115 + fStack_130 * fVar134 + fStack_140 * fVar147;
          auVar219._12_4_ =
               fStack_15c * fStack_3dc +
               fStack_14c * fVar118 + fStack_12c * fVar135 + fStack_13c * fVar104;
          fVar148 = (float)local_2e8._0_4_ - (float)local_338._0_4_;
          fVar156 = (float)local_2e8._4_4_ - (float)local_338._4_4_;
          fVar157 = fStack_2e0 - fStack_330;
          fVar158 = fStack_2dc - fStack_32c;
          local_1f8._0_4_ = fVar176 - fVar186;
          local_1f8._4_4_ = fVar177 - fVar190;
          fStack_1f0 = fVar178 - fVar192;
          fStack_1ec = fVar185 - fVar194;
          local_278 = (RTCFilterFunctionN)CONCAT44(fVar190,fVar186);
          uStack_270 = (RTCFilterFunctionN)CONCAT44(fVar194,fVar192);
          fVar187 = fVar186 * fVar148 - (float)local_338._0_4_ * (float)local_1f8._0_4_;
          fVar191 = fVar190 * fVar156 - (float)local_338._4_4_ * (float)local_1f8._4_4_;
          fVar193 = fVar192 * fVar157 - fStack_330 * fStack_1f0;
          fVar195 = fVar194 * fVar158 - fStack_32c * fStack_1ec;
          auVar59 = maxps(auVar90,auVar219);
          bVar28 = fVar187 * fVar187 <=
                   auVar59._0_4_ * auVar59._0_4_ *
                   (fVar148 * fVar148 + (float)local_1f8._0_4_ * (float)local_1f8._0_4_) &&
                   (int)local_f8 < local_58;
          local_188._0_4_ = -(uint)bVar28;
          bVar27 = (int)(local_f8 | 1) < iStack_54 &&
                   fVar191 * fVar191 <=
                   auVar59._4_4_ * auVar59._4_4_ *
                   (fVar156 * fVar156 + (float)local_1f8._4_4_ * (float)local_1f8._4_4_);
          local_188._4_4_ = -(uint)bVar27;
          bVar29 = fVar193 * fVar193 <=
                   auVar59._8_4_ * auVar59._8_4_ * (fVar157 * fVar157 + fStack_1f0 * fStack_1f0) &&
                   (int)(local_f8 | 2) < iStack_50;
          fStack_180 = (float)-(uint)bVar29;
          bVar30 = fVar195 * fVar195 <=
                   auVar59._12_4_ * auVar59._12_4_ * (fVar158 * fVar158 + fStack_1ec * fStack_1ec)
                   && (int)(local_f8 | 3) < iStack_4c;
          register0x0000150c = -(uint)bVar30;
          uVar43 = movmskps((int)pGVar40,_local_188);
          pGVar40 = (Geometry *)(ulong)uVar43;
          if (uVar43 == 0) {
LAB_00a874cf:
            uVar43 = (uint)puVar36;
          }
          else {
            fVar237 = fVar97 * local_388 + fVar123 * local_258 + fVar103 * local_2c8 +
                      (float)local_3e8 * local_3b8;
            fVar240 = fVar146 * fStack_384 + fVar133 * fStack_254 + fVar105 * fStack_2c4 +
                      (float)auStack_3e4._0_4_ * fStack_3b4;
            fStack_420 = fVar147 * fStack_380 + fVar134 * fStack_250 + fVar115 * fStack_2c0 +
                         (float)auStack_3e4._4_4_ * fStack_3b0;
            fStack_41c = fVar104 * fStack_37c + fVar135 * fStack_24c + fVar118 * fStack_2bc +
                         fStack_3dc * fStack_3ac;
            fVar241 = fVar81 * local_388 + local_178 * local_258 + local_288 * local_2c8 +
                      local_348 * local_3b8;
            fVar82 = fVar91 * fStack_384 + fStack_174 * fStack_254 + fStack_284 * fStack_2c4 +
                     fStack_344 * fStack_3b4;
            fVar92 = fVar96 * fStack_380 + fStack_170 * fStack_250 + fStack_280 * fStack_2c0 +
                     fStack_340 * fStack_3b0;
            fVar94 = fVar102 * fStack_37c + fStack_16c * fStack_24c + (float)aStack_27c * fStack_2bc
                     + fStack_33c * fStack_3ac;
            pfVar1 = (float *)(lVar35 + 0x21b457c + lVar41 * 4);
            fVar81 = *pfVar1;
            fVar91 = pfVar1[1];
            fVar96 = pfVar1[2];
            fVar102 = pfVar1[3];
            pfVar1 = (float *)(lVar35 + 0x21b4a00 + lVar41 * 4);
            fVar103 = *pfVar1;
            fVar105 = pfVar1[1];
            fVar115 = pfVar1[2];
            fVar118 = pfVar1[3];
            pfVar1 = (float *)(lVar35 + 0x21b4e84 + lVar41 * 4);
            fVar123 = *pfVar1;
            fVar133 = pfVar1[1];
            fVar134 = pfVar1[2];
            fVar135 = pfVar1[3];
            pfVar1 = (float *)(lVar35 + 0x21b5308 + lVar41 * 4);
            fVar97 = *pfVar1;
            fVar146 = pfVar1[1];
            fVar147 = pfVar1[2];
            fVar104 = pfVar1[3];
            fVar95 = local_1c8 * fVar81 +
                     local_268 * fVar103 + local_3c8 * fVar123 + local_3a8 * fVar97;
            fVar106 = fStack_1c4 * fVar91 +
                      fStack_264 * fVar105 + fStack_3c4 * fVar133 + fStack_3a4 * fVar146;
            fVar107 = fStack_1c0 * fVar96 +
                      fStack_260 * fVar115 + fStack_3c0 * fVar134 + fStack_3a0 * fVar147;
            fVar116 = fStack_1bc * fVar102 +
                      fStack_25c * fVar118 + fStack_3bc * fVar135 + fStack_39c * fVar104;
            fVar224 = local_1d8 * fVar81 +
                      local_1b8 * fVar103 + fVar93 * fVar123 + local_248 * fVar97;
            fVar232 = fStack_1d4 * fVar91 +
                      fStack_1b4 * fVar105 + fVar48 * fVar133 + fStack_244 * fVar146;
            fVar235 = fStack_1d0 * fVar96 +
                      fStack_1b0 * fVar115 + fVar79 * fVar134 + fStack_240 * fVar147;
            fVar238 = fStack_1cc * fVar102 +
                      fStack_1ac * fVar118 + fVar80 * fVar135 + fStack_23c * fVar104;
            pfVar1 = (float *)(lVar35 + 0x21b699c + lVar41 * 4);
            fVar187 = *pfVar1;
            fVar191 = pfVar1[1];
            fVar193 = pfVar1[2];
            fVar195 = pfVar1[3];
            pfVar1 = (float *)(lVar35 + 0x21b72a4 + lVar41 * 4);
            fVar199 = *pfVar1;
            fVar201 = pfVar1[1];
            fVar203 = pfVar1[2];
            fVar205 = pfVar1[3];
            pfVar1 = (float *)(lVar35 + 0x21b7728 + lVar41 * 4);
            fVar211 = *pfVar1;
            fVar212 = pfVar1[1];
            fVar213 = pfVar1[2];
            fVar215 = pfVar1[3];
            pfVar1 = (float *)(lVar35 + 0x21b6e20 + lVar41 * 4);
            fVar222 = *pfVar1;
            fVar223 = pfVar1[1];
            fVar214 = pfVar1[2];
            fVar234 = pfVar1[3];
            fVar117 = local_1c8 * fVar187 +
                      local_268 * fVar222 + local_3c8 * fVar199 + local_3a8 * fVar211;
            fVar119 = fStack_1c4 * fVar191 +
                      fStack_264 * fVar223 + fStack_3c4 * fVar201 + fStack_3a4 * fVar212;
            fVar120 = fStack_1c0 * fVar193 +
                      fStack_260 * fVar214 + fStack_3c0 * fVar203 + fStack_3a0 * fVar213;
            fVar121 = fStack_1bc * fVar195 +
                      fStack_25c * fVar234 + fStack_3bc * fVar205 + fStack_39c * fVar215;
            fVar93 = local_1d8 * fVar187 +
                     local_1b8 * fVar222 + fVar93 * fVar199 + local_248 * fVar211;
            fVar48 = fStack_1d4 * fVar191 +
                     fStack_1b4 * fVar223 + fVar48 * fVar201 + fStack_244 * fVar212;
            fVar79 = fStack_1d0 * fVar193 +
                     fStack_1b0 * fVar214 + fVar79 * fVar203 + fStack_240 * fVar213;
            fVar80 = fStack_1cc * fVar195 +
                     fStack_1ac * fVar234 + fVar80 * fVar205 + fStack_23c * fVar215;
            auVar210._0_8_ = CONCAT44(fVar106,fVar95) & 0x7fffffff7fffffff;
            auVar210._8_4_ = ABS(fVar107);
            auVar210._12_4_ = ABS(fVar116);
            auVar142._0_8_ = CONCAT44(fVar232,fVar224) & 0x7fffffff7fffffff;
            auVar142._8_4_ = ABS(fVar235);
            auVar142._12_4_ = ABS(fVar238);
            auVar59 = maxps(auVar210,auVar142);
            auVar220._0_8_ =
                 CONCAT44(fVar91 * fStack_3b4 +
                          fVar105 * fStack_2c4 + fVar133 * fStack_254 + fVar146 * fStack_384,
                          fVar81 * local_3b8 +
                          fVar103 * local_2c8 + fVar123 * local_258 + fVar97 * local_388) &
                 0x7fffffff7fffffff;
            auVar220._8_4_ =
                 ABS(fVar96 * fStack_3b0 +
                     fVar115 * fStack_2c0 + fVar134 * fStack_250 + fVar147 * fStack_380);
            auVar220._12_4_ =
                 ABS(fVar102 * fStack_3ac +
                     fVar118 * fStack_2bc + fVar135 * fStack_24c + fVar104 * fStack_37c);
            auVar59 = maxps(auVar59,auVar220);
            uVar43 = -(uint)(local_2d8 <= auVar59._0_4_);
            uVar44 = -(uint)(fStack_2d4 <= auVar59._4_4_);
            uVar45 = -(uint)(fStack_2d0 <= auVar59._8_4_);
            uVar46 = -(uint)(fStack_2cc <= auVar59._12_4_);
            auVar143._0_4_ = ~uVar43 & (uint)fVar148;
            auVar143._4_4_ = ~uVar44 & (uint)fVar156;
            auVar143._8_4_ = ~uVar45 & (uint)fVar157;
            auVar143._12_4_ = ~uVar46 & (uint)fVar158;
            auVar198._0_4_ = (uint)fVar95 & uVar43;
            auVar198._4_4_ = (uint)fVar106 & uVar44;
            auVar198._8_4_ = (uint)fVar107 & uVar45;
            auVar198._12_4_ = (uint)fVar116 & uVar46;
            auVar198 = auVar198 | auVar143;
            fVar105 = (float)(~uVar43 & local_1f8._0_4_ | (uint)fVar224 & uVar43);
            fVar118 = (float)(~uVar44 & local_1f8._4_4_ | (uint)fVar232 & uVar44);
            fVar97 = (float)(~uVar45 & (uint)fStack_1f0 | (uint)fVar235 & uVar45);
            fVar146 = (float)(~uVar46 & (uint)fStack_1ec | (uint)fVar238 & uVar46);
            auVar221._0_8_ = CONCAT44(fVar119,fVar117) & 0x7fffffff7fffffff;
            auVar221._8_4_ = ABS(fVar120);
            auVar221._12_4_ = ABS(fVar121);
            auVar99._0_8_ = CONCAT44(fVar48,fVar93) & 0x7fffffff7fffffff;
            auVar99._8_4_ = ABS(fVar79);
            auVar99._12_4_ = ABS(fVar80);
            auVar59 = maxps(auVar221,auVar99);
            auVar76._0_8_ =
                 CONCAT44(fVar191 * fStack_3b4 +
                          fVar223 * fStack_2c4 + fVar201 * fStack_254 + fVar212 * fStack_384,
                          fVar187 * local_3b8 +
                          fVar222 * local_2c8 + fVar199 * local_258 + fVar211 * local_388) &
                 0x7fffffff7fffffff;
            auVar76._8_4_ =
                 ABS(fVar193 * fStack_3b0 +
                     fVar214 * fStack_2c0 + fVar203 * fStack_250 + fVar213 * fStack_380);
            auVar76._12_4_ =
                 ABS(fVar195 * fStack_3ac +
                     fVar234 * fStack_2bc + fVar205 * fStack_24c + fVar215 * fStack_37c);
            auVar59 = maxps(auVar59,auVar76);
            uVar43 = -(uint)(local_2d8 <= auVar59._0_4_);
            uVar44 = -(uint)(fStack_2d4 <= auVar59._4_4_);
            uVar45 = -(uint)(fStack_2d0 <= auVar59._8_4_);
            uVar46 = -(uint)(fStack_2cc <= auVar59._12_4_);
            fVar211 = (float)((uint)fVar117 & uVar43 | ~uVar43 & (uint)fVar148);
            fVar212 = (float)((uint)fVar119 & uVar44 | ~uVar44 & (uint)fVar156);
            fVar213 = (float)((uint)fVar120 & uVar45 | ~uVar45 & (uint)fVar157);
            fVar215 = (float)((uint)fVar121 & uVar46 | ~uVar46 & (uint)fVar158);
            fVar147 = (float)(~uVar43 & local_1f8._0_4_ | (uint)fVar93 & uVar43);
            fVar148 = (float)(~uVar44 & local_1f8._4_4_ | (uint)fVar48 & uVar44);
            fVar157 = (float)(~uVar45 & (uint)fStack_1f0 | (uint)fVar79 & uVar45);
            fVar199 = (float)(~uVar46 & (uint)fStack_1ec | (uint)fVar80 & uVar46);
            fVar102 = auVar198._0_4_;
            fVar93 = auVar198._4_4_;
            fVar48 = auVar198._8_4_;
            fVar79 = auVar198._12_4_;
            auVar129._0_4_ = fVar105 * fVar105 + fVar102 * fVar102;
            auVar129._4_4_ = fVar118 * fVar118 + fVar93 * fVar93;
            auVar129._8_4_ = fVar97 * fVar97 + fVar48 * fVar48;
            auVar129._12_4_ = fVar146 * fVar146 + fVar79 * fVar79;
            auVar59 = rsqrtps(auVar143,auVar129);
            fVar80 = auVar59._0_4_;
            fVar81 = auVar59._4_4_;
            fVar91 = auVar59._8_4_;
            fVar96 = auVar59._12_4_;
            auVar144._0_4_ = fVar80 * fVar80 * auVar129._0_4_ * 0.5 * fVar80;
            auVar144._4_4_ = fVar81 * fVar81 * auVar129._4_4_ * 0.5 * fVar81;
            auVar144._8_4_ = fVar91 * fVar91 * auVar129._8_4_ * 0.5 * fVar91;
            auVar144._12_4_ = fVar96 * fVar96 * auVar129._12_4_ * 0.5 * fVar96;
            fVar123 = fVar80 * 1.5 - auVar144._0_4_;
            fVar133 = fVar81 * 1.5 - auVar144._4_4_;
            fVar134 = fVar91 * 1.5 - auVar144._8_4_;
            fVar135 = fVar96 * 1.5 - auVar144._12_4_;
            auVar130._0_4_ = fVar147 * fVar147 + fVar211 * fVar211;
            auVar130._4_4_ = fVar148 * fVar148 + fVar212 * fVar212;
            auVar130._8_4_ = fVar157 * fVar157 + fVar213 * fVar213;
            auVar130._12_4_ = fVar199 * fVar199 + fVar215 * fVar215;
            auVar59 = rsqrtps(auVar144,auVar130);
            fVar80 = auVar59._0_4_;
            fVar81 = auVar59._4_4_;
            fVar91 = auVar59._8_4_;
            fVar96 = auVar59._12_4_;
            fVar103 = fVar80 * 1.5 - fVar80 * fVar80 * auVar130._0_4_ * 0.5 * fVar80;
            fVar81 = fVar81 * 1.5 - fVar81 * fVar81 * auVar130._4_4_ * 0.5 * fVar81;
            fVar115 = fVar91 * 1.5 - fVar91 * fVar91 * auVar130._8_4_ * 0.5 * fVar91;
            fVar96 = fVar96 * 1.5 - fVar96 * fVar96 * auVar130._12_4_ * 0.5 * fVar96;
            fVar187 = fVar105 * fVar123 * auVar90._0_4_;
            fVar191 = fVar118 * fVar133 * auVar90._4_4_;
            fVar193 = fVar97 * fVar134 * auVar90._8_4_;
            fVar195 = fVar146 * fVar135 * auVar90._12_4_;
            fVar91 = -fVar102 * fVar123 * auVar90._0_4_;
            fVar102 = -fVar93 * fVar133 * auVar90._4_4_;
            fVar105 = -fVar48 * fVar134 * auVar90._8_4_;
            fVar118 = -fVar79 * fVar135 * auVar90._12_4_;
            fVar146 = fVar123 * 0.0 * auVar90._0_4_;
            fVar104 = fVar133 * 0.0 * auVar90._4_4_;
            fVar156 = fVar134 * 0.0 * auVar90._8_4_;
            fVar158 = fVar135 * 0.0 * auVar90._12_4_;
            local_328 = fVar241 + fVar146;
            fStack_324 = fVar82 + fVar104;
            fStack_320 = fVar92 + fVar156;
            fStack_31c = fVar94 + fVar158;
            fVar224 = fVar147 * fVar103 * auVar219._0_4_;
            fVar232 = fVar148 * fVar81 * auVar219._4_4_;
            fVar235 = fVar157 * fVar115 * auVar219._8_4_;
            fVar238 = fVar199 * fVar96 * auVar219._12_4_;
            fVar199 = (float)local_2e8._0_4_ + fVar224;
            fVar201 = (float)local_2e8._4_4_ + fVar232;
            fVar203 = fStack_2e0 + fVar235;
            fVar205 = fStack_2dc + fVar238;
            fVar93 = -fVar211 * fVar103 * auVar219._0_4_;
            fVar48 = -fVar212 * fVar81 * auVar219._4_4_;
            fVar79 = -fVar213 * fVar115 * auVar219._8_4_;
            fVar80 = -fVar215 * fVar96 * auVar219._12_4_;
            fVar211 = fVar176 + fVar93;
            fVar212 = fVar177 + fVar48;
            fVar213 = fVar178 + fVar79;
            fVar215 = fVar185 + fVar80;
            fVar123 = fVar103 * 0.0 * auVar219._0_4_;
            fVar133 = fVar81 * 0.0 * auVar219._4_4_;
            fVar134 = fVar115 * 0.0 * auVar219._8_4_;
            fVar135 = fVar96 * 0.0 * auVar219._12_4_;
            fVar81 = (float)local_338._0_4_ - fVar187;
            fVar96 = (float)local_338._4_4_ - fVar191;
            fVar103 = fStack_330 - fVar193;
            fVar115 = fStack_32c - fVar195;
            fVar222 = fVar237 + fVar123;
            fVar223 = fVar240 + fVar133;
            fVar214 = fStack_420 + fVar134;
            fVar234 = fStack_41c + fVar135;
            fVar97 = fVar186 - fVar91;
            fVar147 = fVar190 - fVar102;
            fVar148 = fVar192 - fVar105;
            fVar157 = fVar194 - fVar118;
            fVar241 = fVar241 - fVar146;
            fVar82 = fVar82 - fVar104;
            fVar92 = fVar92 - fVar156;
            fVar94 = fVar94 - fVar158;
            uVar43 = -(uint)(0.0 < (fVar97 * (fVar222 - fVar241) - fVar241 * (fVar211 - fVar97)) *
                                   0.0 + (fVar241 * (fVar199 - fVar81) -
                                         (fVar222 - fVar241) * fVar81) * 0.0 +
                                         ((fVar211 - fVar97) * fVar81 - (fVar199 - fVar81) * fVar97)
                            );
            uVar44 = -(uint)(0.0 < (fVar147 * (fVar223 - fVar82) - fVar82 * (fVar212 - fVar147)) *
                                   0.0 + (fVar82 * (fVar201 - fVar96) - (fVar223 - fVar82) * fVar96)
                                         * 0.0 + ((fVar212 - fVar147) * fVar96 -
                                                 (fVar201 - fVar96) * fVar147));
            uVar45 = -(uint)(0.0 < (fVar148 * (fVar214 - fVar92) - fVar92 * (fVar213 - fVar148)) *
                                   0.0 + (fVar92 * (fVar203 - fVar103) -
                                         (fVar214 - fVar92) * fVar103) * 0.0 +
                                         ((fVar213 - fVar148) * fVar103 -
                                         (fVar203 - fVar103) * fVar148));
            uVar46 = -(uint)(0.0 < (fVar157 * (fVar234 - fVar94) - fVar94 * (fVar215 - fVar157)) *
                                   0.0 + (fVar94 * (fVar205 - fVar115) -
                                         (fVar234 - fVar94) * fVar115) * 0.0 +
                                         ((fVar215 - fVar157) * fVar115 -
                                         (fVar205 - fVar115) * fVar157));
            fVar187 = (float)((uint)((float)local_2e8._0_4_ - fVar224) & uVar43 |
                             ~uVar43 & (uint)((float)local_338._0_4_ + fVar187));
            fVar191 = (float)((uint)((float)local_2e8._4_4_ - fVar232) & uVar44 |
                             ~uVar44 & (uint)((float)local_338._4_4_ + fVar191));
            fVar193 = (float)((uint)(fStack_2e0 - fVar235) & uVar45 |
                             ~uVar45 & (uint)(fStack_330 + fVar193));
            fVar195 = (float)((uint)(fStack_2dc - fVar238) & uVar46 |
                             ~uVar46 & (uint)(fStack_32c + fVar195));
            fVar224 = (float)((uint)(fVar176 - fVar93) & uVar43 | ~uVar43 & (uint)(fVar186 + fVar91)
                             );
            fVar232 = (float)((uint)(fVar177 - fVar48) & uVar44 |
                             ~uVar44 & (uint)(fVar190 + fVar102));
            fStack_3f0 = (float)((uint)(fVar178 - fVar79) & uVar45 |
                                ~uVar45 & (uint)(fVar192 + fVar105));
            fStack_3ec = (float)((uint)(fVar185 - fVar80) & uVar46 |
                                ~uVar46 & (uint)(fVar194 + fVar118));
            fVar176 = (float)((uint)(fVar237 - fVar123) & uVar43 | ~uVar43 & (uint)local_328);
            fVar177 = (float)((uint)(fVar240 - fVar133) & uVar44 | ~uVar44 & (uint)fStack_324);
            fVar178 = (float)((uint)(fStack_420 - fVar134) & uVar45 | ~uVar45 & (uint)fStack_320);
            fVar185 = (float)((uint)(fStack_41c - fVar135) & uVar46 | ~uVar46 & (uint)fStack_31c);
            fVar91 = (float)((uint)fVar81 & uVar43 | ~uVar43 & (uint)fVar199);
            fVar102 = (float)((uint)fVar96 & uVar44 | ~uVar44 & (uint)fVar201);
            fVar105 = (float)((uint)fVar103 & uVar45 | ~uVar45 & (uint)fVar203);
            fVar118 = (float)((uint)fVar115 & uVar46 | ~uVar46 & (uint)fVar205);
            fVar146 = (float)((uint)fVar97 & uVar43 | ~uVar43 & (uint)fVar211);
            fVar104 = (float)((uint)fVar147 & uVar44 | ~uVar44 & (uint)fVar212);
            fVar156 = (float)((uint)fVar148 & uVar45 | ~uVar45 & (uint)fVar213);
            fVar158 = (float)((uint)fVar157 & uVar46 | ~uVar46 & (uint)fVar215);
            fVar123 = (float)((uint)fVar241 & uVar43 | ~uVar43 & (uint)fVar222);
            fVar133 = (float)((uint)fVar82 & uVar44 | ~uVar44 & (uint)fVar223);
            fVar134 = (float)((uint)fVar92 & uVar45 | ~uVar45 & (uint)fVar214);
            fVar135 = (float)((uint)fVar94 & uVar46 | ~uVar46 & (uint)fVar234);
            fVar186 = (float)((uint)fVar199 & uVar43 | ~uVar43 & (uint)fVar81) - fVar187;
            fVar190 = (float)((uint)fVar201 & uVar44 | ~uVar44 & (uint)fVar96) - fVar191;
            fVar192 = (float)((uint)fVar203 & uVar45 | ~uVar45 & (uint)fVar103) - fVar193;
            fVar194 = (float)((uint)fVar205 & uVar46 | ~uVar46 & (uint)fVar115) - fVar195;
            fVar97 = (float)((uint)fVar211 & uVar43 | ~uVar43 & (uint)fVar97) - fVar224;
            fVar147 = (float)((uint)fVar212 & uVar44 | ~uVar44 & (uint)fVar147) - fVar232;
            fVar148 = (float)((uint)fVar213 & uVar45 | ~uVar45 & (uint)fVar148) - fStack_3f0;
            fVar157 = (float)((uint)fVar215 & uVar46 | ~uVar46 & (uint)fVar157) - fStack_3ec;
            fVar199 = (float)((uint)fVar222 & uVar43 | ~uVar43 & (uint)fVar241) - fVar176;
            fVar201 = (float)((uint)fVar223 & uVar44 | ~uVar44 & (uint)fVar82) - fVar177;
            fVar203 = (float)((uint)fVar214 & uVar45 | ~uVar45 & (uint)fVar92) - fVar178;
            fVar205 = (float)((uint)fVar234 & uVar46 | ~uVar46 & (uint)fVar94) - fVar185;
            fVar222 = fVar187 - fVar91;
            fVar223 = fVar191 - fVar102;
            fVar214 = fVar193 - fVar105;
            fVar234 = fVar195 - fVar118;
            fVar93 = fVar224 - fVar146;
            fVar48 = fVar232 - fVar104;
            fVar79 = fStack_3f0 - fVar156;
            fVar80 = fStack_3ec - fVar158;
            local_3f8 = (Geometry *)CONCAT44(fVar232,fVar224);
            fVar81 = fVar176 - fVar123;
            fVar96 = fVar177 - fVar133;
            fVar103 = fVar178 - fVar134;
            fVar115 = fVar185 - fVar135;
            fVar211 = (fVar224 * fVar199 - fVar176 * fVar97) * 0.0 +
                      (fVar176 * fVar186 - fVar187 * fVar199) * 0.0 +
                      (fVar187 * fVar97 - fVar224 * fVar186);
            fVar212 = (fVar232 * fVar201 - fVar177 * fVar147) * 0.0 +
                      (fVar177 * fVar190 - fVar191 * fVar201) * 0.0 +
                      (fVar191 * fVar147 - fVar232 * fVar190);
            auVar113._4_4_ = fVar212;
            auVar113._0_4_ = fVar211;
            fVar213 = (fStack_3f0 * fVar203 - fVar178 * fVar148) * 0.0 +
                      (fVar178 * fVar192 - fVar193 * fVar203) * 0.0 +
                      (fVar193 * fVar148 - fStack_3f0 * fVar192);
            fVar215 = (fStack_3ec * fVar205 - fVar185 * fVar157) * 0.0 +
                      (fVar185 * fVar194 - fVar195 * fVar205) * 0.0 +
                      (fVar195 * fVar157 - fStack_3ec * fVar194);
            auVar227._0_4_ =
                 (fVar146 * fVar81 - fVar123 * fVar93) * 0.0 +
                 (fVar123 * fVar222 - fVar91 * fVar81) * 0.0 + (fVar91 * fVar93 - fVar146 * fVar222)
            ;
            auVar227._4_4_ =
                 (fVar104 * fVar96 - fVar133 * fVar48) * 0.0 +
                 (fVar133 * fVar223 - fVar102 * fVar96) * 0.0 +
                 (fVar102 * fVar48 - fVar104 * fVar223);
            auVar227._8_4_ =
                 (fVar156 * fVar103 - fVar134 * fVar79) * 0.0 +
                 (fVar134 * fVar214 - fVar105 * fVar103) * 0.0 +
                 (fVar105 * fVar79 - fVar156 * fVar214);
            auVar227._12_4_ =
                 (fVar158 * fVar115 - fVar135 * fVar80) * 0.0 +
                 (fVar135 * fVar234 - fVar118 * fVar115) * 0.0 +
                 (fVar118 * fVar80 - fVar158 * fVar234);
            auVar113._8_4_ = fVar213;
            auVar113._12_4_ = fVar215;
            auVar59 = maxps(auVar113,auVar227);
            bVar28 = auVar59._0_4_ <= 0.0 && bVar28;
            auVar114._0_4_ = -(uint)bVar28;
            bVar27 = auVar59._4_4_ <= 0.0 && bVar27;
            auVar114._4_4_ = -(uint)bVar27;
            bVar29 = auVar59._8_4_ <= 0.0 && bVar29;
            auVar114._8_4_ = -(uint)bVar29;
            bVar30 = auVar59._12_4_ <= 0.0 && bVar30;
            auVar114._12_4_ = -(uint)bVar30;
            iVar33 = movmskps((int)puVar36,auVar114);
            if (iVar33 == 0) {
LAB_00a8752e:
              iVar33 = 0;
              auVar101._8_8_ = uStack_2f0;
              auVar101._0_8_ = local_2f8;
            }
            else {
              fVar91 = local_3d0->tfar;
              fVar105 = fVar93 * fVar199 - fVar81 * fVar97;
              fVar118 = fVar48 * fVar201 - fVar96 * fVar147;
              fVar123 = fVar79 * fVar203 - fVar103 * fVar148;
              fVar133 = fVar80 * fVar205 - fVar115 * fVar157;
              fVar81 = fVar81 * fVar186 - fVar199 * fVar222;
              fVar96 = fVar96 * fVar190 - fVar201 * fVar223;
              fVar102 = fVar103 * fVar192 - fVar203 * fVar214;
              fVar103 = fVar115 * fVar194 - fVar205 * fVar234;
              fVar115 = fVar222 * fVar97 - fVar93 * fVar186;
              fVar134 = fVar223 * fVar147 - fVar48 * fVar190;
              fVar135 = fVar214 * fVar148 - fVar79 * fVar192;
              fVar97 = fVar234 * fVar157 - fVar80 * fVar194;
              auVar100._0_4_ = fVar81 * 0.0 + fVar115;
              auVar100._4_4_ = fVar96 * 0.0 + fVar134;
              auVar100._8_4_ = fVar102 * 0.0 + fVar135;
              auVar100._12_4_ = fVar103 * 0.0 + fVar97;
              auVar155._0_4_ = fVar105 * 0.0 + auVar100._0_4_;
              auVar155._4_4_ = fVar118 * 0.0 + auVar100._4_4_;
              auVar155._8_4_ = fVar123 * 0.0 + auVar100._8_4_;
              auVar155._12_4_ = fVar133 * 0.0 + auVar100._12_4_;
              auVar59 = rcpps(auVar100,auVar155);
              fVar93 = auVar59._0_4_;
              fVar48 = auVar59._4_4_;
              fVar79 = auVar59._8_4_;
              fVar80 = auVar59._12_4_;
              fVar93 = (1.0 - auVar155._0_4_ * fVar93) * fVar93 + fVar93;
              fVar48 = (1.0 - auVar155._4_4_ * fVar48) * fVar48 + fVar48;
              fVar79 = (1.0 - auVar155._8_4_ * fVar79) * fVar79 + fVar79;
              fVar80 = (1.0 - auVar155._12_4_ * fVar80) * fVar80 + fVar80;
              fVar81 = (fVar176 * fVar115 + fVar224 * fVar81 + fVar187 * fVar105) * fVar93;
              fVar96 = (fVar177 * fVar134 + fVar232 * fVar96 + fVar191 * fVar118) * fVar48;
              auVar145._4_4_ = fVar96;
              auVar145._0_4_ = fVar81;
              fVar102 = (fVar178 * fVar135 + fStack_3f0 * fVar102 + fVar193 * fVar123) * fVar79;
              fVar103 = (fVar185 * fVar97 + fStack_3ec * fVar103 + fVar195 * fVar133) * fVar80;
              bVar28 = (local_1e8 <= fVar81 && fVar81 <= fVar91) && bVar28;
              auVar131._0_4_ = -(uint)bVar28;
              bVar27 = (fStack_1e4 <= fVar96 && fVar96 <= fVar91) && bVar27;
              auVar131._4_4_ = -(uint)bVar27;
              bVar29 = (fStack_1e0 <= fVar102 && fVar102 <= fVar91) && bVar29;
              auVar131._8_4_ = -(uint)bVar29;
              bVar30 = (fStack_1dc <= fVar103 && fVar103 <= fVar91) && bVar30;
              auVar131._12_4_ = -(uint)bVar30;
              iVar33 = movmskps(iVar33,auVar131);
              if (iVar33 == 0) goto LAB_00a8752e;
              auVar132._0_8_ =
                   CONCAT44(-(uint)(auVar155._4_4_ != 0.0 && bVar27),
                            -(uint)(auVar155._0_4_ != 0.0 && bVar28));
              auVar132._8_4_ = -(uint)(auVar155._8_4_ != 0.0 && bVar29);
              auVar132._12_4_ = -(uint)(auVar155._12_4_ != 0.0 && bVar30);
              iVar33 = movmskps(iVar33,auVar132);
              auVar101._8_8_ = uStack_2f0;
              auVar101._0_8_ = local_2f8;
              if (iVar33 != 0) {
                fVar211 = fVar211 * fVar93;
                fVar212 = fVar212 * fVar48;
                fVar213 = fVar213 * fVar79;
                fVar215 = fVar215 * fVar80;
                local_458 = (float)((uint)(1.0 - fVar211) & uVar43 | ~uVar43 & (uint)fVar211);
                fStack_454 = (float)((uint)(1.0 - fVar212) & uVar44 | ~uVar44 & (uint)fVar212);
                fStack_450 = (float)((uint)(1.0 - fVar213) & uVar45 | ~uVar45 & (uint)fVar213);
                fStack_44c = (float)((uint)(1.0 - fVar215) & uVar46 | ~uVar46 & (uint)fVar215);
                auVar101._8_4_ = auVar132._8_4_;
                auVar101._0_8_ = auVar132._0_8_;
                auVar101._12_4_ = auVar132._12_4_;
                auVar145._8_4_ = fVar102;
                auVar145._12_4_ = fVar103;
                local_1a8 = (float)(~uVar43 & (uint)(auVar227._0_4_ * fVar93) |
                                   (uint)(1.0 - auVar227._0_4_ * fVar93) & uVar43);
                fStack_1a4 = (float)(~uVar44 & (uint)(auVar227._4_4_ * fVar48) |
                                    (uint)(1.0 - auVar227._4_4_ * fVar48) & uVar44);
                fStack_1a0 = (float)(~uVar45 & (uint)(auVar227._8_4_ * fVar79) |
                                    (uint)(1.0 - auVar227._8_4_ * fVar79) & uVar45);
                fStack_19c = (float)(~uVar46 & (uint)(auVar227._12_4_ * fVar80) |
                                    (uint)(1.0 - auVar227._12_4_ * fVar80) & uVar46);
                local_418 = auVar145;
              }
            }
            iVar33 = movmskps(iVar33,auVar101);
            fVar93 = local_398;
            fVar48 = fStack_394;
            fVar79 = fStack_390;
            fVar80 = fStack_38c;
            if (iVar33 == 0) {
              uVar43 = 0;
            }
            else {
              fVar91 = (auVar219._0_4_ - auVar90._0_4_) * local_458 + auVar90._0_4_;
              fVar96 = (auVar219._4_4_ - auVar90._4_4_) * fStack_454 + auVar90._4_4_;
              fVar102 = (auVar219._8_4_ - auVar90._8_4_) * fStack_450 + auVar90._8_4_;
              fVar103 = (auVar219._12_4_ - auVar90._12_4_) * fStack_44c + auVar90._12_4_;
              fVar81 = local_3d8->depth_scale;
              local_a8._0_4_ =
                   -(uint)(fVar81 * (fVar91 + fVar91) < local_418._0_4_) & auVar101._0_4_;
              local_a8._4_4_ =
                   -(uint)(fVar81 * (fVar96 + fVar96) < local_418._4_4_) & auVar101._4_4_;
              local_a8._8_4_ =
                   -(uint)(fVar81 * (fVar102 + fVar102) < local_418._8_4_) & auVar101._8_4_;
              local_a8._12_4_ =
                   -(uint)(fVar81 * (fVar103 + fVar103) < local_418._12_4_) & auVar101._12_4_;
              uVar43 = movmskps(iVar33,local_a8);
              puVar36 = (undefined1 *)(ulong)uVar43;
              if (uVar43 == 0) goto LAB_00a874cf;
              local_1a8 = local_1a8 + local_1a8 + -1.0;
              fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
              fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
              fStack_19c = fStack_19c + fStack_19c + -1.0;
              local_128 = local_458;
              fStack_124 = fStack_454;
              fStack_120 = fStack_450;
              fStack_11c = fStack_44c;
              local_118 = local_1a8;
              fStack_114 = fStack_1a4;
              fStack_110 = fStack_1a0;
              fStack_10c = fStack_19c;
              local_108 = local_418;
              local_f4 = iVar6;
              local_e8 = local_318;
              fStack_e4 = fStack_314;
              fStack_e0 = fStack_310;
              fStack_dc = fStack_30c;
              local_d8 = local_358;
              fStack_d4 = fStack_354;
              fStack_d0 = fStack_350;
              fStack_cc = fStack_34c;
              local_c8 = local_368;
              fStack_c4 = fStack_364;
              fStack_c0 = fStack_360;
              fStack_bc = fStack_35c;
              local_b8 = local_378;
              fStack_b4 = fStack_374;
              fStack_b0 = fStack_370;
              fStack_ac = fStack_36c;
              pGVar40 = (context->scene->geometries).items[local_300].ptr;
              if ((pGVar40->mask & local_3d0->mask) == 0) {
                bVar32 = 0;
              }
              else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                      (bVar32 = 1, pGVar40->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                fVar93 = (float)(int)local_f8;
                local_98[0] = (fVar93 + local_458 + 0.0) * local_68;
                local_98[1] = (fVar93 + fStack_454 + 1.0) * fStack_64;
                local_98[2] = (fVar93 + fStack_450 + 2.0) * fStack_60;
                local_98[3] = (fVar93 + fStack_44c + 3.0) * fStack_5c;
                local_88 = CONCAT44(fStack_1a4,local_1a8);
                uStack_80 = CONCAT44(fStack_19c,fStack_1a0);
                local_78 = local_418;
                bVar32 = (byte)uVar43;
                local_428 = (ulong)bVar32;
                local_3f8 = (Geometry *)0x0;
                if ((ulong)bVar32 != 0) {
                  for (; (bVar32 >> (long)local_3f8 & 1) == 0;
                      local_3f8 = (Geometry *)((long)local_3f8 + 1)) {
                  }
                }
                _auStack_3e4 = auVar219._4_12_;
                local_3e8 = (undefined1  [4])local_3d0->tfar;
                local_208 = context;
                uStack_400 = auVar90._8_8_;
                local_408 = pGVar40;
                do {
                  local_22c = local_98[(long)local_3f8];
                  local_228 = *(undefined4 *)((long)&local_88 + (long)local_3f8 * 4);
                  local_3d0->tfar = *(float *)(local_78 + (long)local_3f8 * 4);
                  fVar93 = 1.0 - local_22c;
                  fVar79 = local_22c * 3.0;
                  fVar80 = ((fVar79 + 2.0) * (fVar93 + fVar93) + fVar93 * -3.0 * fVar93) * 0.5;
                  fVar48 = (fVar93 * -2.0 * local_22c + local_22c * local_22c) * 0.5;
                  fVar79 = (local_22c * fVar79 + (fVar79 + -5.0) * (local_22c + local_22c)) * 0.5;
                  fVar93 = (local_22c * (fVar93 + fVar93) - fVar93 * fVar93) * 0.5;
                  local_2b8._16_8_ = local_208->user;
                  local_238 = CONCAT44(fVar93 * fStack_314 +
                                       fVar79 * fStack_354 +
                                       fVar80 * fStack_364 + fVar48 * fStack_374,
                                       fVar93 * local_318 +
                                       fVar79 * local_358 + fVar80 * local_368 + fVar48 * local_378)
                  ;
                  local_230 = fVar93 * fStack_310 +
                              fVar79 * fStack_350 + fVar80 * fStack_360 + fVar48 * fStack_370;
                  local_224 = (int)local_200;
                  local_220 = (int)local_300;
                  local_21c = *(uint *)&(((Device *)local_2b8._16_8_)->super_State).super_RefCount.
                                        _vptr_RefCount;
                  local_218 = *(uint *)((long)&(((Device *)local_2b8._16_8_)->super_State).
                                               super_RefCount._vptr_RefCount + 4);
                  local_45c = 0xffffffff;
                  local_2b8._0_8_ = &local_45c;
                  local_2b8._8_8_ = pGVar40->userPtr;
                  local_2b8._24_8_ = local_3d0;
                  local_2b8._32_8_ = &local_238;
                  local_290 = 1.4013e-45;
                  pp_Var31 = &pGVar40->occlusionFilterN;
                  if (*pp_Var31 == (RTCFilterFunctionN)0x0) {
LAB_00a873a5:
                    pp_Var37 = (_func_int **)local_208->args->filter;
                    if ((pp_Var37 != (_func_int **)0x0) &&
                       (((local_208->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        ((*(byte *)((long)local_408 + 0x3e) & 0x40) != 0)))) {
                      pGVar40 = (Geometry *)local_2b8;
                      (*(code *)pp_Var37)((RTCFilterFunctionNArguments *)pGVar40);
                      pp_Var37 = (_func_int **)local_2b8._0_8_;
                      if (*(int *)local_2b8._0_8_ == 0) goto LAB_00a873ed;
                    }
                    uVar43 = (uint)pp_Var37;
                    bVar32 = 1;
                    context = local_208;
                    goto LAB_00a874dc;
                  }
                  pGVar40 = (Geometry *)local_2b8;
                  (**pp_Var31)((RTCFilterFunctionNArguments *)pGVar40);
                  if (*(int *)local_2b8._0_8_ != 0) goto LAB_00a873a5;
LAB_00a873ed:
                  local_3d0->tfar = (float)local_3e8;
                  local_428 = local_428 ^ 1L << ((ulong)local_3f8 & 0x3f);
                  local_3f8 = (Geometry *)0x0;
                  if (local_428 != 0) {
                    for (; (local_428 >> (long)local_3f8 & 1) == 0;
                        local_3f8 = (Geometry *)((long)local_3f8 + 1)) {
                    }
                  }
                  bVar32 = 0;
                  pGVar40 = local_408;
                } while (local_428 != 0);
                uVar43 = 0;
                context = local_208;
              }
LAB_00a874dc:
              bVar39 = (bool)(bVar39 | bVar32);
              fVar93 = local_398;
              fVar48 = fStack_394;
              fVar79 = fStack_390;
              fVar80 = fStack_38c;
            }
          }
          lVar41 = lVar41 + 4;
        } while ((int)lVar41 < iVar6);
      }
      if (bVar39) {
        return bVar39;
      }
      fVar93 = local_3d0->tfar;
      auVar89._4_4_ = -(uint)(fStack_44 <= fVar93);
      auVar89._0_4_ = -(uint)(local_48 <= fVar93);
      auVar89._8_4_ = -(uint)(fStack_40 <= fVar93);
      auVar89._12_4_ = -(uint)(fStack_3c <= fVar93);
      uVar43 = movmskps(uVar43,auVar89);
      uVar43 = (uint)uVar42 & uVar43;
    } while (uVar43 != 0);
  }
  return bVar39;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }